

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  byte bVar57;
  uint uVar58;
  uint uVar59;
  long lVar60;
  uint uVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined4 uVar65;
  float fVar66;
  vint4 bi_2;
  undefined1 auVar67 [16];
  float fVar94;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar95;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined8 uVar96;
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 extraout_var [56];
  float fVar123;
  float fVar135;
  float fVar136;
  vint4 bi;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar137;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar138;
  float fVar154;
  float fVar156;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar157;
  undefined1 auVar141 [16];
  float fVar155;
  float fVar158;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 ai_2;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  vint4 ai_1;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  vint4 ai;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  float fVar207;
  float fVar221;
  float fVar222;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar223;
  undefined1 auVar220 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar232 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar238;
  float fVar239;
  float fVar255;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar283 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [64];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  float fVar313;
  float fVar314;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar315;
  undefined1 auVar306 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar307 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar322 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  undefined1 local_608 [8];
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined1 local_558 [32];
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined1 local_518 [32];
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [16];
  undefined1 (*local_448) [16];
  Primitive *local_440;
  undefined1 local_438 [32];
  RTCFilterFunctionNArguments local_418;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  uint auStack_388 [4];
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  uint uStack_248;
  float afStack_244 [7];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  undefined1 auVar321 [32];
  
  PVar4 = prim[1];
  uVar54 = (ulong)(byte)PVar4;
  lVar56 = uVar54 * 0x25;
  auVar150 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar151 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar151 = vinsertps_avx(auVar151,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar62 = *(float *)(prim + lVar56 + 0x12);
  auVar150 = vsubps_avx(auVar150,*(undefined1 (*) [16])(prim + lVar56 + 6));
  auVar67._0_4_ = fVar62 * auVar150._0_4_;
  auVar67._4_4_ = fVar62 * auVar150._4_4_;
  auVar67._8_4_ = fVar62 * auVar150._8_4_;
  auVar67._12_4_ = fVar62 * auVar150._12_4_;
  auVar124._0_4_ = fVar62 * auVar151._0_4_;
  auVar124._4_4_ = fVar62 * auVar151._4_4_;
  auVar124._8_4_ = fVar62 * auVar151._8_4_;
  auVar124._12_4_ = fVar62 * auVar151._12_4_;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 4 + 6)));
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 5 + 6)));
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 6 + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xf + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar54 + 6)));
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x1a + 6)));
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x1b + 6)));
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x1c + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar303._4_4_ = auVar124._0_4_;
  auVar303._0_4_ = auVar124._0_4_;
  auVar303._8_4_ = auVar124._0_4_;
  auVar303._12_4_ = auVar124._0_4_;
  auVar18 = vshufps_avx(auVar124,auVar124,0x55);
  auVar210 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar62 = auVar210._0_4_;
  auVar256._0_4_ = fVar62 * auVar147._0_4_;
  fVar63 = auVar210._4_4_;
  auVar256._4_4_ = fVar63 * auVar147._4_4_;
  fVar64 = auVar210._8_4_;
  auVar256._8_4_ = fVar64 * auVar147._8_4_;
  fVar94 = auVar210._12_4_;
  auVar256._12_4_ = fVar94 * auVar147._12_4_;
  auVar240._0_4_ = auVar191._0_4_ * fVar62;
  auVar240._4_4_ = auVar191._4_4_ * fVar63;
  auVar240._8_4_ = auVar191._8_4_ * fVar64;
  auVar240._12_4_ = auVar191._12_4_ * fVar94;
  auVar227._0_4_ = auVar17._0_4_ * fVar62;
  auVar227._4_4_ = auVar17._4_4_ * fVar63;
  auVar227._8_4_ = auVar17._8_4_ * fVar64;
  auVar227._12_4_ = auVar17._12_4_ * fVar94;
  auVar210 = vfmadd231ps_fma(auVar256,auVar18,auVar151);
  auVar257 = vfmadd231ps_fma(auVar240,auVar18,auVar15);
  auVar18 = vfmadd231ps_fma(auVar227,auVar16,auVar18);
  auVar68 = vfmadd231ps_fma(auVar210,auVar303,auVar150);
  auVar257 = vfmadd231ps_fma(auVar257,auVar303,auVar14);
  auVar69 = vfmadd231ps_fma(auVar18,auVar173,auVar303);
  auVar304._4_4_ = auVar67._0_4_;
  auVar304._0_4_ = auVar67._0_4_;
  auVar304._8_4_ = auVar67._0_4_;
  auVar304._12_4_ = auVar67._0_4_;
  auVar18 = vshufps_avx(auVar67,auVar67,0x55);
  auVar210 = vshufps_avx(auVar67,auVar67,0xaa);
  fVar62 = auVar210._0_4_;
  auVar125._0_4_ = fVar62 * auVar147._0_4_;
  fVar63 = auVar210._4_4_;
  auVar125._4_4_ = fVar63 * auVar147._4_4_;
  fVar64 = auVar210._8_4_;
  auVar125._8_4_ = fVar64 * auVar147._8_4_;
  fVar94 = auVar210._12_4_;
  auVar125._12_4_ = fVar94 * auVar147._12_4_;
  auVar97._0_4_ = auVar191._0_4_ * fVar62;
  auVar97._4_4_ = auVar191._4_4_ * fVar63;
  auVar97._8_4_ = auVar191._8_4_ * fVar64;
  auVar97._12_4_ = auVar191._12_4_ * fVar94;
  auVar283._0_4_ = auVar17._0_4_ * fVar62;
  auVar283._4_4_ = auVar17._4_4_ * fVar63;
  auVar283._8_4_ = auVar17._8_4_ * fVar64;
  auVar283._12_4_ = auVar17._12_4_ * fVar94;
  auVar151 = vfmadd231ps_fma(auVar125,auVar18,auVar151);
  auVar147 = vfmadd231ps_fma(auVar97,auVar18,auVar15);
  auVar15 = vfmadd231ps_fma(auVar283,auVar18,auVar16);
  auVar97 = vfmadd231ps_fma(auVar151,auVar304,auVar150);
  auVar98 = vfmadd231ps_fma(auVar147,auVar304,auVar14);
  local_398._8_4_ = 0x7fffffff;
  local_398._0_8_ = 0x7fffffff7fffffff;
  local_398._12_4_ = 0x7fffffff;
  auVar150 = vandps_avx(auVar68,local_398);
  auVar208._8_4_ = 0x219392ef;
  auVar208._0_8_ = 0x219392ef219392ef;
  auVar208._12_4_ = 0x219392ef;
  auVar150 = vcmpps_avx(auVar150,auVar208,1);
  auVar151 = vblendvps_avx(auVar68,auVar208,auVar150);
  auVar150 = vandps_avx(auVar257,local_398);
  auVar150 = vcmpps_avx(auVar150,auVar208,1);
  auVar147 = vblendvps_avx(auVar257,auVar208,auVar150);
  auVar150 = vandps_avx(auVar69,local_398);
  auVar150 = vcmpps_avx(auVar150,auVar208,1);
  auVar150 = vblendvps_avx(auVar69,auVar208,auVar150);
  auVar99 = vfmadd231ps_fma(auVar15,auVar304,auVar173);
  auVar14 = vrcpps_avx(auVar151);
  auVar209._8_4_ = 0x3f800000;
  auVar209._0_8_ = 0x3f8000003f800000;
  auVar209._12_4_ = 0x3f800000;
  auVar151 = vfnmadd213ps_fma(auVar151,auVar14,auVar209);
  auVar68 = vfmadd132ps_fma(auVar151,auVar14,auVar14);
  auVar151 = vrcpps_avx(auVar147);
  auVar147 = vfnmadd213ps_fma(auVar147,auVar151,auVar209);
  auVar69 = vfmadd132ps_fma(auVar147,auVar151,auVar151);
  auVar151 = vrcpps_avx(auVar150);
  auVar150 = vfnmadd213ps_fma(auVar150,auVar151,auVar209);
  auVar67 = vfmadd132ps_fma(auVar150,auVar151,auVar151);
  fVar62 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar56 + 0x16)) *
           *(float *)(prim + lVar56 + 0x1a);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar54 * 7 + 6);
  auVar150 = vpmovsxwd_avx(auVar150);
  auVar188._4_4_ = fVar62;
  auVar188._0_4_ = fVar62;
  auVar188._8_4_ = fVar62;
  auVar188._12_4_ = fVar62;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + uVar54 * 0xb + 6);
  auVar151 = vpmovsxwd_avx(auVar151);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar150);
  auVar283 = vfmadd213ps_fma(auVar151,auVar188,auVar150);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar54 * 9 + 6);
  auVar150 = vpmovsxwd_avx(auVar147);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar54 * 0xd + 6);
  auVar151 = vpmovsxwd_avx(auVar14);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar150);
  auVar147 = vfmadd213ps_fma(auVar151,auVar188,auVar150);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar54 * 0x12 + 6);
  auVar150 = vpmovsxwd_avx(auVar15);
  uVar55 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar54 * 2 + uVar55 + 6);
  auVar151 = vpmovsxwd_avx(auVar191);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar150);
  auVar14 = vfmadd213ps_fma(auVar151,auVar188,auVar150);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar55 + 6);
  auVar150 = vpmovsxwd_avx(auVar173);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar54 * 0x18 + 6);
  auVar151 = vpmovsxwd_avx(auVar16);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar150);
  auVar15 = vfmadd213ps_fma(auVar151,auVar188,auVar150);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar54 * 0x1d + 6);
  auVar150 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar4 * 0x20 + 6);
  auVar151 = vpmovsxwd_avx(auVar18);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar150);
  auVar191 = vfmadd213ps_fma(auVar151,auVar188,auVar150);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar4 * 0x20 - uVar54) + 6);
  auVar150 = vpmovsxwd_avx(auVar210);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar257._8_8_ = 0;
  auVar257._0_8_ = *(ulong *)(prim + uVar54 * 0x23 + 6);
  auVar151 = vpmovsxwd_avx(auVar257);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar150);
  auVar151 = vfmadd213ps_fma(auVar151,auVar188,auVar150);
  auVar150 = vsubps_avx(auVar283,auVar97);
  auVar176._0_4_ = auVar68._0_4_ * auVar150._0_4_;
  auVar176._4_4_ = auVar68._4_4_ * auVar150._4_4_;
  auVar176._8_4_ = auVar68._8_4_ * auVar150._8_4_;
  auVar176._12_4_ = auVar68._12_4_ * auVar150._12_4_;
  auVar150 = vsubps_avx(auVar147,auVar97);
  auVar274._0_4_ = auVar68._0_4_ * auVar150._0_4_;
  auVar274._4_4_ = auVar68._4_4_ * auVar150._4_4_;
  auVar274._8_4_ = auVar68._8_4_ * auVar150._8_4_;
  auVar274._12_4_ = auVar68._12_4_ * auVar150._12_4_;
  auVar150 = vsubps_avx(auVar14,auVar98);
  auVar144._0_4_ = auVar69._0_4_ * auVar150._0_4_;
  auVar144._4_4_ = auVar69._4_4_ * auVar150._4_4_;
  auVar144._8_4_ = auVar69._8_4_ * auVar150._8_4_;
  auVar144._12_4_ = auVar69._12_4_ * auVar150._12_4_;
  auVar150 = vsubps_avx(auVar15,auVar98);
  auVar98._0_4_ = auVar69._0_4_ * auVar150._0_4_;
  auVar98._4_4_ = auVar69._4_4_ * auVar150._4_4_;
  auVar98._8_4_ = auVar69._8_4_ * auVar150._8_4_;
  auVar98._12_4_ = auVar69._12_4_ * auVar150._12_4_;
  auVar150 = vsubps_avx(auVar191,auVar99);
  auVar159._0_4_ = auVar67._0_4_ * auVar150._0_4_;
  auVar159._4_4_ = auVar67._4_4_ * auVar150._4_4_;
  auVar159._8_4_ = auVar67._8_4_ * auVar150._8_4_;
  auVar159._12_4_ = auVar67._12_4_ * auVar150._12_4_;
  auVar150 = vsubps_avx(auVar151,auVar99);
  auVar68._0_4_ = auVar67._0_4_ * auVar150._0_4_;
  auVar68._4_4_ = auVar67._4_4_ * auVar150._4_4_;
  auVar68._8_4_ = auVar67._8_4_ * auVar150._8_4_;
  auVar68._12_4_ = auVar67._12_4_ * auVar150._12_4_;
  auVar150 = vpminsd_avx(auVar176,auVar274);
  auVar151 = vpminsd_avx(auVar144,auVar98);
  auVar150 = vmaxps_avx(auVar150,auVar151);
  auVar151 = vpminsd_avx(auVar159,auVar68);
  uVar65 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar228._4_4_ = uVar65;
  auVar228._0_4_ = uVar65;
  auVar228._8_4_ = uVar65;
  auVar228._12_4_ = uVar65;
  auVar151 = vmaxps_avx(auVar151,auVar228);
  auVar150 = vmaxps_avx(auVar150,auVar151);
  local_358._0_4_ = auVar150._0_4_ * 0.99999964;
  local_358._4_4_ = auVar150._4_4_ * 0.99999964;
  local_358._8_4_ = auVar150._8_4_ * 0.99999964;
  local_358._12_4_ = auVar150._12_4_ * 0.99999964;
  auVar150 = vpmaxsd_avx(auVar176,auVar274);
  auVar151 = vpmaxsd_avx(auVar144,auVar98);
  auVar150 = vminps_avx(auVar150,auVar151);
  auVar151 = vpmaxsd_avx(auVar159,auVar68);
  uVar65 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar126._4_4_ = uVar65;
  auVar126._0_4_ = uVar65;
  auVar126._8_4_ = uVar65;
  auVar126._12_4_ = uVar65;
  auVar151 = vminps_avx(auVar151,auVar126);
  auVar150 = vminps_avx(auVar150,auVar151);
  auVar69._0_4_ = auVar150._0_4_ * 1.0000004;
  auVar69._4_4_ = auVar150._4_4_ * 1.0000004;
  auVar69._8_4_ = auVar150._8_4_ * 1.0000004;
  auVar69._12_4_ = auVar150._12_4_ * 1.0000004;
  auVar99._1_3_ = 0;
  auVar99[0] = PVar4;
  auVar99[4] = PVar4;
  auVar99._5_3_ = 0;
  auVar99[8] = PVar4;
  auVar99._9_3_ = 0;
  auVar99[0xc] = PVar4;
  auVar99._13_3_ = 0;
  auVar151 = vpcmpgtd_avx(auVar99,_DAT_01f7fcf0);
  auVar150 = vcmpps_avx(local_358,auVar69,2);
  auVar150 = vandps_avx(auVar150,auVar151);
  uVar52 = vmovmskps_avx(auVar150);
  if (uVar52 == 0) {
    return;
  }
  uVar52 = uVar52 & 0xff;
  auVar91._16_16_ = mm_lookupmask_ps._240_16_;
  auVar91._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar91,ZEXT832(0) << 0x20,0x80);
  local_448 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_440 = prim;
  do {
    lVar56 = 0;
    for (uVar54 = (ulong)uVar52; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
      lVar56 = lVar56 + 1;
    }
    uVar53 = *(uint *)(local_440 + 2);
    uVar5 = *(uint *)(local_440 + lVar56 * 4 + 6);
    pGVar6 = (context->scene->geometries).items[uVar53].ptr;
    fVar62 = (pGVar6->time_range).lower;
    fVar62 = pGVar6->fnumTimeSegments *
             ((*(float *)(ray + k * 4 + 0x70) - fVar62) / ((pGVar6->time_range).upper - fVar62));
    auVar150 = vroundss_avx(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62),9);
    auVar150 = vminss_avx(auVar150,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
    auVar210 = vmaxss_avx(ZEXT816(0),auVar150);
    uVar54 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                             (ulong)uVar5 *
                             pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar60 = (long)(int)auVar210._0_4_ * 0x38;
    lVar8 = *(long *)(_Var7 + lVar60);
    lVar9 = *(long *)(_Var7 + 0x10 + lVar60);
    auVar150 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar54);
    lVar56 = uVar54 + 1;
    auVar151 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar56);
    lVar1 = uVar54 + 2;
    auVar147 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar1);
    lVar2 = uVar54 + 3;
    auVar14 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar2);
    lVar8 = *(long *)&pGVar6[4].fnumTimeSegments;
    lVar9 = *(long *)(lVar8 + lVar60);
    lVar10 = *(long *)(lVar8 + 0x10 + lVar60);
    auVar15 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar54);
    auVar191 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar56);
    auVar173 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
    auVar16 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
    auVar257 = ZEXT816(0) << 0x40;
    auVar279._0_4_ = auVar14._0_4_ * 0.0;
    auVar279._4_4_ = auVar14._4_4_ * 0.0;
    auVar279._8_4_ = auVar14._8_4_ * 0.0;
    auVar279._12_4_ = auVar14._12_4_ * 0.0;
    auVar17 = vfmadd231ps_fma(auVar279,auVar147,auVar257);
    auVar69 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar151,auVar17);
    auVar316._8_4_ = 0x40400000;
    auVar316._0_8_ = 0x4040000040400000;
    auVar316._12_4_ = 0x40400000;
    auVar17 = vfmadd231ps_fma(auVar17,auVar151,auVar316);
    auVar159 = vfnmadd231ps_fma(auVar17,auVar150,auVar316);
    auVar189._0_4_ = auVar16._0_4_ * 0.0;
    auVar189._4_4_ = auVar16._4_4_ * 0.0;
    auVar189._8_4_ = auVar16._8_4_ * 0.0;
    auVar189._12_4_ = auVar16._12_4_ * 0.0;
    auVar18 = vfmadd231ps_fma(auVar189,auVar173,auVar257);
    auVar17 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar191,auVar18);
    auVar241._0_4_ = auVar15._0_4_ + auVar17._0_4_;
    auVar241._4_4_ = auVar15._4_4_ + auVar17._4_4_;
    auVar241._8_4_ = auVar15._8_4_ + auVar17._8_4_;
    auVar241._12_4_ = auVar15._12_4_ + auVar17._12_4_;
    auVar17 = vfmadd231ps_fma(auVar18,auVar191,auVar316);
    auVar18 = vfnmadd231ps_fma(auVar17,auVar15,auVar316);
    auVar139._0_12_ = ZEXT812(0);
    auVar139._12_4_ = 0;
    auVar67 = vfmadd213ps_fma(auVar139,auVar147,auVar14);
    auVar140._0_4_ = auVar14._0_4_ * 3.0;
    auVar140._4_4_ = auVar14._4_4_ * 3.0;
    auVar140._8_4_ = auVar14._8_4_ * 3.0;
    auVar140._12_4_ = auVar14._12_4_ * 3.0;
    auVar147 = vfnmadd231ps_fma(auVar140,auVar316,auVar147);
    auVar147 = vfmadd231ps_fma(auVar147,auVar257,auVar151);
    auVar144 = vfnmadd231ps_fma(auVar147,auVar257,auVar150);
    auVar147 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar173,auVar16);
    auVar147 = vfmadd231ps_fma(auVar147,auVar191,auVar257);
    auVar17 = vfmadd231ps_fma(auVar147,auVar15,auVar257);
    auVar229._0_4_ = auVar16._0_4_ * 3.0;
    auVar229._4_4_ = auVar16._4_4_ * 3.0;
    auVar229._8_4_ = auVar16._8_4_ * 3.0;
    auVar229._12_4_ = auVar16._12_4_ * 3.0;
    auVar147 = vfnmadd231ps_fma(auVar229,auVar316,auVar173);
    auVar147 = vfmadd231ps_fma(auVar147,auVar257,auVar191);
    auVar15 = vfnmadd231ps_fma(auVar147,auVar257,auVar15);
    auVar147 = vshufps_avx(auVar159,auVar159,0xc9);
    auVar14 = vshufps_avx(auVar241,auVar241,0xc9);
    fVar225 = auVar159._0_4_;
    auVar100._0_4_ = fVar225 * auVar14._0_4_;
    fVar226 = auVar159._4_4_;
    auVar100._4_4_ = fVar226 * auVar14._4_4_;
    fVar239 = auVar159._8_4_;
    auVar100._8_4_ = fVar239 * auVar14._8_4_;
    fVar255 = auVar159._12_4_;
    auVar100._12_4_ = fVar255 * auVar14._12_4_;
    auVar97 = vfmsub231ps_fma(auVar100,auVar147,auVar241);
    auVar14 = vshufps_avx(auVar18,auVar18,0xc9);
    auVar101._0_4_ = fVar225 * auVar14._0_4_;
    auVar101._4_4_ = fVar226 * auVar14._4_4_;
    auVar101._8_4_ = fVar239 * auVar14._8_4_;
    auVar101._12_4_ = fVar255 * auVar14._12_4_;
    auVar98 = vfmsub231ps_fma(auVar101,auVar147,auVar18);
    auVar147 = vshufps_avx(auVar144,auVar144,0xc9);
    auVar14 = vshufps_avx(auVar17,auVar17,0xc9);
    fVar66 = auVar144._0_4_;
    auVar102._0_4_ = fVar66 * auVar14._0_4_;
    fVar154 = auVar144._4_4_;
    auVar102._4_4_ = fVar154 * auVar14._4_4_;
    fVar207 = auVar144._8_4_;
    auVar102._8_4_ = fVar207 * auVar14._8_4_;
    fVar157 = auVar144._12_4_;
    auVar102._12_4_ = fVar157 * auVar14._12_4_;
    auVar99 = vfmsub231ps_fma(auVar102,auVar147,auVar17);
    auVar14 = vshufps_avx(auVar15,auVar15,0xc9);
    auVar103._0_4_ = fVar66 * auVar14._0_4_;
    auVar103._4_4_ = fVar154 * auVar14._4_4_;
    auVar103._8_4_ = fVar207 * auVar14._8_4_;
    auVar103._12_4_ = fVar157 * auVar14._12_4_;
    auVar124 = vfmsub231ps_fma(auVar103,auVar147,auVar15);
    lVar9 = *(long *)(_Var7 + 0x38 + lVar60);
    lVar10 = *(long *)(_Var7 + 0x48 + lVar60);
    auVar147 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar56);
    auVar14 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
    auVar15 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
    lVar11 = *(long *)(lVar8 + 0x38 + lVar60);
    lVar8 = *(long *)(lVar8 + 0x48 + lVar60);
    auVar230._0_4_ = auVar15._0_4_ * 0.0;
    auVar230._4_4_ = auVar15._4_4_ * 0.0;
    auVar230._8_4_ = auVar15._8_4_ * 0.0;
    auVar230._12_4_ = auVar15._12_4_ * 0.0;
    auVar191 = vfmadd231ps_fma(auVar230,auVar14,auVar257);
    auVar283 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar147,auVar191);
    auVar173 = vfmadd231ps_fma(auVar191,auVar147,auVar316);
    auVar191 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar54);
    auVar188 = vfnmadd231ps_fma(auVar173,auVar191,auVar316);
    auVar173 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar8);
    auVar16 = *(undefined1 (*) [16])(lVar11 + lVar8 * lVar2);
    auVar291._0_4_ = auVar16._0_4_ * 0.0;
    auVar291._4_4_ = auVar16._4_4_ * 0.0;
    auVar291._8_4_ = auVar16._8_4_ * 0.0;
    auVar291._12_4_ = auVar16._12_4_ * 0.0;
    auVar68 = vfmadd231ps_fma(auVar291,auVar173,auVar257);
    auVar17 = *(undefined1 (*) [16])(lVar11 + lVar56 * lVar8);
    auVar257 = vfmadd213ps_fma(auVar257,auVar17,auVar68);
    auVar18 = *(undefined1 (*) [16])(lVar11 + uVar54 * lVar8);
    auVar271._0_4_ = auVar257._0_4_ + auVar18._0_4_;
    auVar271._4_4_ = auVar257._4_4_ + auVar18._4_4_;
    auVar271._8_4_ = auVar257._8_4_ + auVar18._8_4_;
    auVar271._12_4_ = auVar257._12_4_ + auVar18._12_4_;
    auVar257 = vshufps_avx(auVar271,auVar271,0xc9);
    fVar221 = auVar188._0_4_;
    auVar160._0_4_ = fVar221 * auVar257._0_4_;
    fVar222 = auVar188._4_4_;
    auVar160._4_4_ = fVar222 * auVar257._4_4_;
    fVar223 = auVar188._8_4_;
    auVar160._8_4_ = fVar223 * auVar257._8_4_;
    fVar224 = auVar188._12_4_;
    auVar160._12_4_ = fVar224 * auVar257._12_4_;
    auVar257 = vshufps_avx(auVar188,auVar188,0xc9);
    auVar125 = vfmsub231ps_fma(auVar160,auVar257,auVar271);
    auVar68 = vfmadd231ps_fma(auVar68,auVar17,auVar316);
    auVar274 = vfnmadd231ps_fma(auVar68,auVar18,auVar316);
    auVar68 = vshufps_avx(auVar274,auVar274,0xc9);
    auVar161._0_4_ = fVar221 * auVar68._0_4_;
    auVar161._4_4_ = fVar222 * auVar68._4_4_;
    auVar161._8_4_ = fVar223 * auVar68._8_4_;
    auVar161._12_4_ = fVar224 * auVar68._12_4_;
    auVar68 = vfmsub231ps_fma(auVar161,auVar257,auVar274);
    auVar257 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar14,auVar15);
    auVar305._0_4_ = auVar15._0_4_ * 3.0;
    auVar305._4_4_ = auVar15._4_4_ * 3.0;
    auVar305._8_4_ = auVar15._8_4_ * 3.0;
    auVar305._12_4_ = auVar15._12_4_ * 3.0;
    auVar274 = vfnmadd231ps_fma(auVar305,auVar316,auVar14);
    auVar14 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar173,auVar16);
    auVar141._0_4_ = auVar16._0_4_ * 3.0;
    auVar141._4_4_ = auVar16._4_4_ * 3.0;
    auVar141._8_4_ = auVar16._8_4_ * 3.0;
    auVar141._12_4_ = auVar16._12_4_ * 3.0;
    auVar15 = vfnmadd231ps_fma(auVar141,auVar316,auVar173);
    auVar126 = ZEXT816(0) << 0x20;
    auVar14 = vfmadd231ps_fma(auVar14,auVar17,auVar126);
    auVar15 = vfmadd231ps_fma(auVar15,auVar126,auVar17);
    auVar173 = vfmadd231ps_fma(auVar14,auVar18,auVar126);
    auVar16 = vfnmadd231ps_fma(auVar15,auVar126,auVar18);
    auVar14 = vfmadd231ps_fma(auVar274,auVar126,auVar147);
    auVar176 = vfnmadd231ps_fma(auVar14,auVar126,auVar191);
    auVar14 = vshufps_avx(auVar173,auVar173,0xc9);
    fVar95 = auVar176._0_4_;
    auVar104._0_4_ = fVar95 * auVar14._0_4_;
    fVar313 = auVar176._4_4_;
    auVar104._4_4_ = fVar313 * auVar14._4_4_;
    fVar314 = auVar176._8_4_;
    auVar104._8_4_ = fVar314 * auVar14._8_4_;
    fVar315 = auVar176._12_4_;
    auVar104._12_4_ = fVar315 * auVar14._12_4_;
    auVar14 = vshufps_avx(auVar176,auVar176,0xc9);
    auVar274 = vfmsub231ps_fma(auVar104,auVar14,auVar173);
    auVar15 = vshufps_avx(auVar16,auVar16,0xc9);
    auVar70._0_4_ = fVar95 * auVar15._0_4_;
    auVar70._4_4_ = fVar313 * auVar15._4_4_;
    auVar70._8_4_ = fVar314 * auVar15._8_4_;
    auVar70._12_4_ = fVar315 * auVar15._12_4_;
    auVar126 = vfmsub231ps_fma(auVar70,auVar14,auVar16);
    fVar62 = fVar62 - auVar210._0_4_;
    auVar48._12_4_ = 0;
    auVar48._0_12_ = ZEXT812(0);
    auVar151 = vfmadd231ps_fma(auVar67,auVar48 << 0x20,auVar151);
    local_578 = auVar69._0_4_;
    fStack_574 = auVar69._4_4_;
    fStack_570 = auVar69._8_4_;
    fStack_56c = auVar69._12_4_;
    auVar162._0_4_ = auVar150._0_4_ + local_578;
    auVar162._4_4_ = auVar150._4_4_ + fStack_574;
    auVar162._8_4_ = auVar150._8_4_ + fStack_570;
    auVar162._12_4_ = auVar150._12_4_ + fStack_56c;
    auVar17 = vfmadd231ps_fma(auVar151,auVar150,auVar48 << 0x20);
    auVar14 = vpermilps_avx(auVar97,0xc9);
    auVar150 = vdpps_avx(auVar14,auVar14,0x7f);
    fVar64 = auVar150._0_4_;
    auVar173 = ZEXT416((uint)fVar64);
    auVar151 = vrsqrtss_avx(auVar173,auVar173);
    fVar63 = auVar151._0_4_;
    auVar15 = vpermilps_avx(auVar98,0xc9);
    auVar151 = vdpps_avx(auVar14,auVar15,0x7f);
    fVar94 = fVar63 * 1.5 - fVar64 * 0.5 * fVar63 * fVar63 * fVar63;
    auVar242._0_4_ = fVar64 * auVar15._0_4_;
    auVar242._4_4_ = fVar64 * auVar15._4_4_;
    auVar242._8_4_ = fVar64 * auVar15._8_4_;
    auVar242._12_4_ = fVar64 * auVar15._12_4_;
    fVar63 = auVar151._0_4_;
    auVar105._0_4_ = fVar63 * auVar14._0_4_;
    auVar105._4_4_ = fVar63 * auVar14._4_4_;
    auVar105._8_4_ = fVar63 * auVar14._8_4_;
    auVar105._12_4_ = fVar63 * auVar14._12_4_;
    auVar15 = vsubps_avx(auVar242,auVar105);
    auVar151 = vrcpss_avx(auVar173,auVar173);
    auVar150 = vfnmadd213ss_fma(auVar150,auVar151,SUB6416(ZEXT464(0x40000000),0));
    fVar63 = auVar151._0_4_ * auVar150._0_4_;
    auVar173 = vpermilps_avx(auVar99,0xc9);
    auVar151 = vdpps_avx(auVar173,auVar173,0x7f);
    fVar123 = auVar14._0_4_ * fVar94;
    fVar135 = auVar14._4_4_ * fVar94;
    fVar136 = auVar14._8_4_ * fVar94;
    fVar137 = auVar14._12_4_ * fVar94;
    auVar150 = vblendps_avx(auVar151,_DAT_01f7aa10,0xe);
    auVar14 = vrsqrtss_avx(auVar150,auVar150);
    fVar64 = auVar151._0_4_;
    fVar238 = auVar14._0_4_;
    fVar238 = fVar238 * 1.5 - fVar64 * 0.5 * fVar238 * fVar238 * fVar238;
    auVar16 = vpermilps_avx(auVar124,0xc9);
    auVar14 = vdpps_avx(auVar173,auVar16,0x7f);
    auVar190._0_4_ = auVar16._0_4_ * fVar64;
    auVar190._4_4_ = auVar16._4_4_ * fVar64;
    auVar190._8_4_ = auVar16._8_4_ * fVar64;
    auVar190._12_4_ = auVar16._12_4_ * fVar64;
    fVar64 = auVar14._0_4_;
    auVar272._0_4_ = fVar64 * auVar173._0_4_;
    auVar272._4_4_ = fVar64 * auVar173._4_4_;
    auVar272._8_4_ = fVar64 * auVar173._8_4_;
    auVar272._12_4_ = fVar64 * auVar173._12_4_;
    auVar14 = vsubps_avx(auVar190,auVar272);
    auVar150 = vrcpss_avx(auVar150,auVar150);
    auVar151 = vfnmadd213ss_fma(auVar151,auVar150,ZEXT416(0x40000000));
    fVar64 = auVar150._0_4_ * auVar151._0_4_;
    fVar138 = auVar173._0_4_ * fVar238;
    fVar155 = auVar173._4_4_ * fVar238;
    fVar156 = auVar173._8_4_ * fVar238;
    fVar158 = auVar173._12_4_ * fVar238;
    auVar150 = vshufps_avx(auVar159,auVar159,0xff);
    auVar151 = vshufps_avx(auVar162,auVar162,0xff);
    auVar243._0_4_ = auVar151._0_4_ * fVar123;
    auVar243._4_4_ = auVar151._4_4_ * fVar135;
    auVar243._8_4_ = auVar151._8_4_ * fVar136;
    auVar243._12_4_ = auVar151._12_4_ * fVar137;
    auVar71._0_4_ = auVar150._0_4_ * fVar123 + auVar151._0_4_ * fVar94 * fVar63 * auVar15._0_4_;
    auVar71._4_4_ = auVar150._4_4_ * fVar135 + auVar151._4_4_ * fVar94 * fVar63 * auVar15._4_4_;
    auVar71._8_4_ = auVar150._8_4_ * fVar136 + auVar151._8_4_ * fVar94 * fVar63 * auVar15._8_4_;
    auVar71._12_4_ = auVar150._12_4_ * fVar137 + auVar151._12_4_ * fVar94 * fVar63 * auVar15._12_4_;
    auVar15 = vsubps_avx(auVar162,auVar243);
    local_5b8._4_4_ = auVar243._4_4_ + auVar162._4_4_;
    local_5b8._0_4_ = auVar243._0_4_ + auVar162._0_4_;
    fStack_5b0 = auVar243._8_4_ + auVar162._8_4_;
    fStack_5ac = auVar243._12_4_ + auVar162._12_4_;
    auVar173 = vsubps_avx(auVar159,auVar71);
    auVar150 = vshufps_avx(auVar144,auVar144,0xff);
    auVar151 = vshufps_avx(auVar17,auVar17,0xff);
    auVar142._0_4_ = auVar151._0_4_ * fVar138;
    auVar142._4_4_ = auVar151._4_4_ * fVar155;
    auVar142._8_4_ = auVar151._8_4_ * fVar156;
    auVar142._12_4_ = auVar151._12_4_ * fVar158;
    auVar106._0_4_ = auVar150._0_4_ * fVar138 + auVar151._0_4_ * fVar238 * auVar14._0_4_ * fVar64;
    auVar106._4_4_ = auVar150._4_4_ * fVar155 + auVar151._4_4_ * fVar238 * auVar14._4_4_ * fVar64;
    auVar106._8_4_ = auVar150._8_4_ * fVar156 + auVar151._8_4_ * fVar238 * auVar14._8_4_ * fVar64;
    auVar106._12_4_ =
         auVar150._12_4_ * fVar158 + auVar151._12_4_ * fVar238 * auVar14._12_4_ * fVar64;
    auVar14 = vsubps_avx(auVar17,auVar142);
    local_588._4_4_ = auVar17._4_4_ + auVar142._4_4_;
    local_588._0_4_ = auVar17._0_4_ + auVar142._0_4_;
    fStack_580 = auVar17._8_4_ + auVar142._8_4_;
    fStack_57c = auVar17._12_4_ + auVar142._12_4_;
    auVar16 = vsubps_avx(auVar144,auVar106);
    auVar151 = vfmadd231ps_fma(auVar257,ZEXT816(0) << 0x20,auVar147);
    local_538 = auVar283._0_4_;
    fStack_534 = auVar283._4_4_;
    fStack_530 = auVar283._8_4_;
    fStack_52c = auVar283._12_4_;
    auVar244._0_4_ = auVar191._0_4_ + local_538;
    auVar244._4_4_ = auVar191._4_4_ + fStack_534;
    auVar244._8_4_ = auVar191._8_4_ + fStack_530;
    auVar244._12_4_ = auVar191._12_4_ + fStack_52c;
    auVar17 = vpermilps_avx(auVar125,0xc9);
    auVar150 = vdpps_avx(auVar17,auVar17,0x7f);
    auVar18 = vfmadd231ps_fma(auVar151,auVar191,ZEXT816(0) << 0x20);
    fVar63 = auVar150._0_4_;
    auVar191 = ZEXT416((uint)fVar63);
    auVar151 = vrsqrtss_avx(auVar191,auVar191);
    fVar64 = auVar151._0_4_;
    fVar94 = fVar64 * 1.5 - fVar63 * 0.5 * fVar64 * fVar64 * fVar64;
    auVar151 = vpermilps_avx(auVar68,0xc9);
    auVar273._0_4_ = fVar63 * auVar151._0_4_;
    auVar273._4_4_ = fVar63 * auVar151._4_4_;
    auVar273._8_4_ = fVar63 * auVar151._8_4_;
    auVar273._12_4_ = fVar63 * auVar151._12_4_;
    auVar151 = vdpps_avx(auVar17,auVar151,0x7f);
    fVar63 = auVar151._0_4_;
    auVar258._0_4_ = fVar63 * auVar17._0_4_;
    auVar258._4_4_ = fVar63 * auVar17._4_4_;
    auVar258._8_4_ = fVar63 * auVar17._8_4_;
    auVar258._12_4_ = fVar63 * auVar17._12_4_;
    auVar147 = vsubps_avx(auVar273,auVar258);
    auVar151 = vrcpss_avx(auVar191,auVar191);
    auVar150 = vfnmadd213ss_fma(auVar150,auVar151,SUB6416(ZEXT464(0x40000000),0));
    fVar63 = auVar151._0_4_ * auVar150._0_4_;
    fVar138 = auVar17._0_4_ * fVar94;
    fVar155 = auVar17._4_4_ * fVar94;
    fVar156 = auVar17._8_4_ * fVar94;
    fVar158 = auVar17._12_4_ * fVar94;
    auVar17 = vpermilps_avx(auVar274,0xc9);
    auVar150 = vdpps_avx(auVar17,auVar17,0x7f);
    fVar64 = auVar150._0_4_;
    auVar210 = ZEXT416((uint)fVar64);
    auVar151 = vrsqrtss_avx(auVar210,auVar210);
    fVar238 = auVar151._0_4_;
    auVar191 = vpermilps_avx(auVar126,0xc9);
    auVar151 = vdpps_avx(auVar17,auVar191,0x7f);
    fVar238 = fVar238 * 1.5 - fVar64 * 0.5 * fVar238 * fVar238 * fVar238;
    auVar280._0_4_ = fVar64 * auVar191._0_4_;
    auVar280._4_4_ = fVar64 * auVar191._4_4_;
    auVar280._8_4_ = fVar64 * auVar191._8_4_;
    auVar280._12_4_ = fVar64 * auVar191._12_4_;
    fVar64 = auVar151._0_4_;
    auVar72._0_4_ = auVar17._0_4_ * fVar64;
    auVar72._4_4_ = auVar17._4_4_ * fVar64;
    auVar72._8_4_ = auVar17._8_4_ * fVar64;
    auVar72._12_4_ = auVar17._12_4_ * fVar64;
    auVar191 = vsubps_avx(auVar280,auVar72);
    auVar151 = vrcpss_avx(auVar210,auVar210);
    auVar150 = vfnmadd213ss_fma(auVar150,auVar151,SUB6416(ZEXT464(0x40000000),0));
    fVar64 = auVar151._0_4_ * auVar150._0_4_;
    fVar123 = auVar17._0_4_ * fVar238;
    fVar135 = auVar17._4_4_ * fVar238;
    fVar136 = auVar17._8_4_ * fVar238;
    fVar137 = auVar17._12_4_ * fVar238;
    auVar150 = vshufps_avx(auVar188,auVar188,0xff);
    auVar151 = vshufps_avx(auVar244,auVar244,0xff);
    auVar163._0_4_ = auVar151._0_4_ * fVar138;
    auVar163._4_4_ = auVar151._4_4_ * fVar155;
    auVar163._8_4_ = auVar151._8_4_ * fVar156;
    auVar163._12_4_ = auVar151._12_4_ * fVar158;
    auVar192._0_4_ = auVar150._0_4_ * fVar138 + fVar94 * auVar147._0_4_ * fVar63 * auVar151._0_4_;
    auVar192._4_4_ = auVar150._4_4_ * fVar155 + fVar94 * auVar147._4_4_ * fVar63 * auVar151._4_4_;
    auVar192._8_4_ = auVar150._8_4_ * fVar156 + fVar94 * auVar147._8_4_ * fVar63 * auVar151._8_4_;
    auVar192._12_4_ =
         auVar150._12_4_ * fVar158 + fVar94 * auVar147._12_4_ * fVar63 * auVar151._12_4_;
    auVar147 = vsubps_avx(auVar244,auVar163);
    auVar17 = vsubps_avx(auVar188,auVar192);
    auVar150 = vshufps_avx(auVar176,auVar176,0xff);
    auVar151 = vshufps_avx(auVar18,auVar18,0xff);
    auVar107._0_4_ = auVar151._0_4_ * fVar123;
    auVar107._4_4_ = auVar151._4_4_ * fVar135;
    auVar107._8_4_ = auVar151._8_4_ * fVar136;
    auVar107._12_4_ = auVar151._12_4_ * fVar137;
    auVar73._0_4_ = auVar150._0_4_ * fVar123 + auVar151._0_4_ * fVar238 * auVar191._0_4_ * fVar64;
    auVar73._4_4_ = auVar150._4_4_ * fVar135 + auVar151._4_4_ * fVar238 * auVar191._4_4_ * fVar64;
    auVar73._8_4_ = auVar150._8_4_ * fVar136 + auVar151._8_4_ * fVar238 * auVar191._8_4_ * fVar64;
    auVar73._12_4_ =
         auVar150._12_4_ * fVar137 + auVar151._12_4_ * fVar238 * auVar191._12_4_ * fVar64;
    auVar150 = vsubps_avx(auVar18,auVar107);
    auVar164._0_4_ = auVar18._0_4_ + auVar107._0_4_;
    auVar164._4_4_ = auVar18._4_4_ + auVar107._4_4_;
    auVar164._8_4_ = auVar18._8_4_ + auVar107._8_4_;
    auVar164._12_4_ = auVar18._12_4_ + auVar107._12_4_;
    auVar151 = vsubps_avx(auVar176,auVar73);
    local_668 = auVar173._0_4_;
    fStack_664 = auVar173._4_4_;
    fStack_660 = auVar173._8_4_;
    fStack_65c = auVar173._12_4_;
    auVar74._0_4_ = auVar15._0_4_ + local_668 * 0.33333334;
    auVar74._4_4_ = auVar15._4_4_ + fStack_664 * 0.33333334;
    auVar74._8_4_ = auVar15._8_4_ + fStack_660 * 0.33333334;
    auVar74._12_4_ = auVar15._12_4_ + fStack_65c * 0.33333334;
    fVar63 = 1.0 - fVar62;
    auVar245._4_4_ = fVar63;
    auVar245._0_4_ = fVar63;
    auVar245._8_4_ = fVar63;
    auVar245._12_4_ = fVar63;
    auVar211._0_4_ = fVar62 * auVar147._0_4_;
    auVar211._4_4_ = fVar62 * auVar147._4_4_;
    auVar211._8_4_ = fVar62 * auVar147._8_4_;
    auVar211._12_4_ = fVar62 * auVar147._12_4_;
    local_3c8 = vfmadd231ps_fma(auVar211,auVar245,auVar15);
    auVar127._0_4_ = fVar62 * (auVar17._0_4_ * 0.33333334 + auVar147._0_4_);
    auVar127._4_4_ = fVar62 * (auVar17._4_4_ * 0.33333334 + auVar147._4_4_);
    auVar127._8_4_ = fVar62 * (auVar17._8_4_ * 0.33333334 + auVar147._8_4_);
    auVar127._12_4_ = fVar62 * (auVar17._12_4_ * 0.33333334 + auVar147._12_4_);
    auVar17 = vfmadd231ps_fma(auVar127,auVar245,auVar74);
    auVar75._0_4_ = auVar16._0_4_ * 0.33333334;
    auVar75._4_4_ = auVar16._4_4_ * 0.33333334;
    auVar75._8_4_ = auVar16._8_4_ * 0.33333334;
    auVar75._12_4_ = auVar16._12_4_ * 0.33333334;
    auVar147 = vsubps_avx(auVar14,auVar75);
    auVar292._0_4_ = auVar243._0_4_ + auVar162._0_4_ + (fVar225 + auVar71._0_4_) * 0.33333334;
    auVar292._4_4_ = auVar243._4_4_ + auVar162._4_4_ + (fVar226 + auVar71._4_4_) * 0.33333334;
    auVar292._8_4_ = auVar243._8_4_ + auVar162._8_4_ + (fVar239 + auVar71._8_4_) * 0.33333334;
    auVar292._12_4_ = auVar243._12_4_ + auVar162._12_4_ + (fVar255 + auVar71._12_4_) * 0.33333334;
    auVar212._0_4_ = (fVar66 + auVar106._0_4_) * 0.33333334;
    auVar212._4_4_ = (fVar154 + auVar106._4_4_) * 0.33333334;
    auVar212._8_4_ = (fVar207 + auVar106._8_4_) * 0.33333334;
    auVar212._12_4_ = (fVar157 + auVar106._12_4_) * 0.33333334;
    auVar15 = vsubps_avx(_local_588,auVar212);
    auVar281._0_4_ = auVar151._0_4_ * 0.33333334;
    auVar281._4_4_ = auVar151._4_4_ * 0.33333334;
    auVar281._8_4_ = auVar151._8_4_ * 0.33333334;
    auVar281._12_4_ = auVar151._12_4_ * 0.33333334;
    auVar151 = vsubps_avx(auVar150,auVar281);
    auVar259._0_4_ = (fVar95 + auVar73._0_4_) * 0.33333334;
    auVar259._4_4_ = (fVar313 + auVar73._4_4_) * 0.33333334;
    auVar259._8_4_ = (fVar314 + auVar73._8_4_) * 0.33333334;
    auVar259._12_4_ = (fVar315 + auVar73._12_4_) * 0.33333334;
    auVar191 = vsubps_avx(auVar164,auVar259);
    auVar282._0_4_ = fVar62 * auVar151._0_4_;
    auVar282._4_4_ = fVar62 * auVar151._4_4_;
    auVar282._8_4_ = fVar62 * auVar151._8_4_;
    auVar282._12_4_ = fVar62 * auVar151._12_4_;
    auVar231._0_4_ = fVar62 * auVar150._0_4_;
    auVar231._4_4_ = fVar62 * auVar150._4_4_;
    auVar231._8_4_ = fVar62 * auVar150._8_4_;
    auVar231._12_4_ = fVar62 * auVar150._12_4_;
    local_3d8 = vfmadd231ps_fma(auVar282,auVar245,auVar147);
    auVar16 = vfmadd231ps_fma(auVar231,auVar245,auVar14);
    auVar76._0_4_ = fVar62 * (auVar244._0_4_ + auVar163._0_4_);
    auVar76._4_4_ = fVar62 * (auVar244._4_4_ + auVar163._4_4_);
    auVar76._8_4_ = fVar62 * (auVar244._8_4_ + auVar163._8_4_);
    auVar76._12_4_ = fVar62 * (auVar244._12_4_ + auVar163._12_4_);
    auVar174._0_4_ =
         fVar62 * (auVar244._0_4_ + auVar163._0_4_ + (fVar221 + auVar192._0_4_) * 0.33333334);
    auVar174._4_4_ =
         fVar62 * (auVar244._4_4_ + auVar163._4_4_ + (fVar222 + auVar192._4_4_) * 0.33333334);
    auVar174._8_4_ =
         fVar62 * (auVar244._8_4_ + auVar163._8_4_ + (fVar223 + auVar192._8_4_) * 0.33333334);
    auVar174._12_4_ =
         fVar62 * (auVar244._12_4_ + auVar163._12_4_ + (fVar224 + auVar192._12_4_) * 0.33333334);
    auVar193._0_4_ = fVar62 * auVar191._0_4_;
    auVar193._4_4_ = fVar62 * auVar191._4_4_;
    auVar193._8_4_ = fVar62 * auVar191._8_4_;
    auVar193._12_4_ = fVar62 * auVar191._12_4_;
    auVar108._0_4_ = fVar62 * auVar164._0_4_;
    auVar108._4_4_ = fVar62 * auVar164._4_4_;
    auVar108._8_4_ = fVar62 * auVar164._8_4_;
    auVar108._12_4_ = fVar62 * auVar164._12_4_;
    _local_3e8 = vfmadd231ps_fma(auVar76,auVar245,_local_5b8);
    auVar18 = vfmadd231ps_fma(auVar174,auVar245,auVar292);
    auVar210 = vfmadd231ps_fma(auVar193,auVar245,auVar15);
    auVar257 = vfmadd231ps_fma(auVar108,auVar245,_local_588);
    auVar150 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    local_3a8 = vsubps_avx(local_3c8,auVar150);
    auVar151 = vshufps_avx(local_3a8,local_3a8,0x55);
    auVar147 = vshufps_avx(local_3a8,local_3a8,0xaa);
    aVar3 = pre->ray_space[k].vy.field_0;
    fVar62 = pre->ray_space[k].vz.field_0.m128[0];
    fVar63 = pre->ray_space[k].vz.field_0.m128[1];
    fVar64 = pre->ray_space[k].vz.field_0.m128[2];
    fVar94 = pre->ray_space[k].vz.field_0.m128[3];
    auVar77._0_4_ = fVar62 * auVar147._0_4_;
    auVar77._4_4_ = fVar63 * auVar147._4_4_;
    auVar77._8_4_ = fVar64 * auVar147._8_4_;
    auVar77._12_4_ = fVar94 * auVar147._12_4_;
    auVar14 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar3,auVar151);
    local_3b8 = vsubps_avx(auVar17,auVar150);
    auVar151 = vshufps_avx(local_3b8,local_3b8,0x55);
    auVar147 = vshufps_avx(local_3b8,local_3b8,0xaa);
    auVar317._0_4_ = fVar62 * auVar147._0_4_;
    auVar317._4_4_ = fVar63 * auVar147._4_4_;
    auVar317._8_4_ = fVar64 * auVar147._8_4_;
    auVar317._12_4_ = fVar94 * auVar147._12_4_;
    auVar147 = vfmadd231ps_fma(auVar317,(undefined1  [16])aVar3,auVar151);
    local_2a8 = vsubps_avx(local_3d8,auVar150);
    auVar151 = vshufps_avx(local_2a8,local_2a8,0xaa);
    auVar293._0_4_ = fVar62 * auVar151._0_4_;
    auVar293._4_4_ = fVar63 * auVar151._4_4_;
    auVar293._8_4_ = fVar64 * auVar151._8_4_;
    auVar293._12_4_ = fVar94 * auVar151._12_4_;
    auVar151 = vshufps_avx(local_2a8,local_2a8,0x55);
    auVar15 = vfmadd231ps_fma(auVar293,(undefined1  [16])aVar3,auVar151);
    local_2b8 = vsubps_avx(auVar16,auVar150);
    auVar151 = vshufps_avx(local_2b8,local_2b8,0xaa);
    auVar306._0_4_ = fVar62 * auVar151._0_4_;
    auVar306._4_4_ = fVar63 * auVar151._4_4_;
    auVar306._8_4_ = fVar64 * auVar151._8_4_;
    auVar306._12_4_ = fVar94 * auVar151._12_4_;
    auVar151 = vshufps_avx(local_2b8,local_2b8,0x55);
    auVar191 = vfmadd231ps_fma(auVar306,(undefined1  [16])aVar3,auVar151);
    local_2c8 = vsubps_avx(_local_3e8,auVar150);
    auVar151 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar165._0_4_ = fVar62 * auVar151._0_4_;
    auVar165._4_4_ = fVar63 * auVar151._4_4_;
    auVar165._8_4_ = fVar64 * auVar151._8_4_;
    auVar165._12_4_ = fVar94 * auVar151._12_4_;
    auVar151 = vshufps_avx(local_2c8,local_2c8,0x55);
    auVar173 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar3,auVar151);
    local_2d8 = vsubps_avx(auVar18,auVar150);
    auVar151 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar213._0_4_ = fVar62 * auVar151._0_4_;
    auVar213._4_4_ = fVar63 * auVar151._4_4_;
    auVar213._8_4_ = fVar64 * auVar151._8_4_;
    auVar213._12_4_ = fVar94 * auVar151._12_4_;
    auVar151 = vshufps_avx(local_2d8,local_2d8,0x55);
    auVar68 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar3,auVar151);
    local_2e8 = vsubps_avx(auVar210,auVar150);
    auVar151 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar246._0_4_ = fVar62 * auVar151._0_4_;
    auVar246._4_4_ = fVar63 * auVar151._4_4_;
    auVar246._8_4_ = fVar64 * auVar151._8_4_;
    auVar246._12_4_ = fVar94 * auVar151._12_4_;
    auVar151 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar151 = vfmadd231ps_fma(auVar246,(undefined1  [16])aVar3,auVar151);
    local_2f8 = vsubps_avx(auVar257,auVar150);
    auVar150 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar175._0_4_ = fVar62 * auVar150._0_4_;
    auVar175._4_4_ = fVar63 * auVar150._4_4_;
    auVar175._8_4_ = fVar64 * auVar150._8_4_;
    auVar175._12_4_ = fVar94 * auVar150._12_4_;
    auVar150 = vshufps_avx(local_2f8,local_2f8,0x55);
    auVar150 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar3,auVar150);
    auVar194._4_4_ = local_3a8._0_4_;
    auVar194._0_4_ = local_3a8._0_4_;
    auVar194._8_4_ = local_3a8._0_4_;
    auVar194._12_4_ = local_3a8._0_4_;
    aVar3 = pre->ray_space[k].vx.field_0;
    auVar69 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar3,auVar194);
    auVar195._4_4_ = local_3b8._0_4_;
    auVar195._0_4_ = local_3b8._0_4_;
    auVar195._8_4_ = local_3b8._0_4_;
    auVar195._12_4_ = local_3b8._0_4_;
    auVar67 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar3,auVar195);
    uVar65 = local_2a8._0_4_;
    auVar196._4_4_ = uVar65;
    auVar196._0_4_ = uVar65;
    auVar196._8_4_ = uVar65;
    auVar196._12_4_ = uVar65;
    auVar283 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar3,auVar196);
    uVar65 = local_2b8._0_4_;
    auVar197._4_4_ = uVar65;
    auVar197._0_4_ = uVar65;
    auVar197._8_4_ = uVar65;
    auVar197._12_4_ = uVar65;
    auVar97 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar3,auVar197);
    uVar65 = local_2c8._0_4_;
    auVar198._4_4_ = uVar65;
    auVar198._0_4_ = uVar65;
    auVar198._8_4_ = uVar65;
    auVar198._12_4_ = uVar65;
    auVar98 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar3,auVar198);
    uVar65 = local_2d8._0_4_;
    auVar199._4_4_ = uVar65;
    auVar199._0_4_ = uVar65;
    auVar199._8_4_ = uVar65;
    auVar199._12_4_ = uVar65;
    auVar68 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar3,auVar199);
    uVar65 = local_2e8._0_4_;
    auVar200._4_4_ = uVar65;
    auVar200._0_4_ = uVar65;
    auVar200._8_4_ = uVar65;
    auVar200._12_4_ = uVar65;
    auVar99 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar3,auVar200);
    uVar65 = local_2f8._0_4_;
    auVar201._4_4_ = uVar65;
    auVar201._0_4_ = uVar65;
    auVar201._8_4_ = uVar65;
    auVar201._12_4_ = uVar65;
    auVar124 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar3,auVar201);
    auVar14 = vmovlhps_avx(auVar69,auVar98);
    auVar15 = vmovlhps_avx(auVar67,auVar68);
    auVar191 = vmovlhps_avx(auVar283,auVar99);
    auVar173 = vmovlhps_avx(auVar97,auVar124);
    auVar150 = vminps_avx(auVar14,auVar15);
    auVar151 = vminps_avx(auVar191,auVar173);
    auVar147 = vminps_avx(auVar150,auVar151);
    auVar150 = vmaxps_avx(auVar14,auVar15);
    auVar151 = vmaxps_avx(auVar191,auVar173);
    auVar150 = vmaxps_avx(auVar150,auVar151);
    auVar151 = vshufpd_avx(auVar147,auVar147,3);
    auVar147 = vminps_avx(auVar147,auVar151);
    auVar151 = vshufpd_avx(auVar150,auVar150,3);
    auVar151 = vmaxps_avx(auVar150,auVar151);
    auVar150 = vandps_avx(local_398,auVar147);
    auVar151 = vandps_avx(auVar151,local_398);
    auVar150 = vmaxps_avx(auVar150,auVar151);
    auVar151 = vmovshdup_avx(auVar150);
    auVar150 = vmaxss_avx(auVar151,auVar150);
    fVar63 = auVar150._0_4_ * 9.536743e-07;
    auVar232._8_8_ = auVar69._0_8_;
    auVar232._0_8_ = auVar69._0_8_;
    auVar260._8_8_ = auVar67._0_8_;
    auVar260._0_8_ = auVar67._0_8_;
    auVar294._0_8_ = auVar283._0_8_;
    auVar294._8_8_ = auVar294._0_8_;
    auVar307._0_8_ = auVar97._0_8_;
    auVar307._8_8_ = auVar307._0_8_;
    local_268 = fVar63;
    fStack_264 = fVar63;
    fStack_260 = fVar63;
    fStack_25c = fVar63;
    fStack_258 = fVar63;
    fStack_254 = fVar63;
    fStack_250 = fVar63;
    fStack_24c = fVar63;
    local_78 = -fVar63;
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    fStack_68 = local_78;
    fStack_64 = local_78;
    fStack_60 = local_78;
    fStack_5c = local_78;
    local_368 = uVar53;
    uStack_364 = uVar53;
    uStack_360 = uVar53;
    uStack_35c = uVar53;
    local_378 = uVar5;
    uStack_374 = uVar5;
    uStack_370 = uVar5;
    uStack_36c = uVar5;
    uVar61 = 0;
    fVar62 = *(float *)(ray + k * 4 + 0x30);
    local_278 = vsubps_avx(auVar15,auVar14);
    local_288 = vsubps_avx(auVar191,auVar15);
    local_298 = vsubps_avx(auVar173,auVar191);
    local_318 = vsubps_avx(_local_3e8,local_3c8);
    local_328 = vsubps_avx(auVar18,auVar17);
    local_338 = vsubps_avx(auVar210,local_3d8);
    _local_348 = vsubps_avx(auVar257,auVar16);
    auVar187 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar278 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_016ad969:
    local_308 = auVar278._0_16_;
    auVar176 = auVar187._0_16_;
    auVar150 = vshufps_avx(auVar176,auVar176,0x50);
    auVar318._8_4_ = 0x3f800000;
    auVar318._0_8_ = 0x3f8000003f800000;
    auVar318._12_4_ = 0x3f800000;
    auVar321._16_4_ = 0x3f800000;
    auVar321._0_16_ = auVar318;
    auVar321._20_4_ = 0x3f800000;
    auVar321._24_4_ = 0x3f800000;
    auVar321._28_4_ = 0x3f800000;
    auVar151 = vsubps_avx(auVar318,auVar150);
    fVar64 = auVar150._0_4_;
    fVar138 = auVar98._0_4_;
    auVar78._0_4_ = fVar138 * fVar64;
    fVar94 = auVar150._4_4_;
    fVar154 = auVar98._4_4_;
    auVar78._4_4_ = fVar154 * fVar94;
    fVar238 = auVar150._8_4_;
    auVar78._8_4_ = fVar138 * fVar238;
    fVar123 = auVar150._12_4_;
    auVar78._12_4_ = fVar154 * fVar123;
    fVar155 = auVar68._0_4_;
    auVar202._0_4_ = fVar155 * fVar64;
    fVar156 = auVar68._4_4_;
    auVar202._4_4_ = fVar156 * fVar94;
    auVar202._8_4_ = fVar155 * fVar238;
    auVar202._12_4_ = fVar156 * fVar123;
    fVar157 = auVar99._0_4_;
    auVar166._0_4_ = fVar157 * fVar64;
    fVar158 = auVar99._4_4_;
    auVar166._4_4_ = fVar158 * fVar94;
    auVar166._8_4_ = fVar157 * fVar238;
    auVar166._12_4_ = fVar158 * fVar123;
    fVar239 = auVar124._0_4_;
    auVar128._0_4_ = fVar239 * fVar64;
    fVar255 = auVar124._4_4_;
    auVar128._4_4_ = fVar255 * fVar94;
    auVar128._8_4_ = fVar239 * fVar238;
    auVar128._12_4_ = fVar255 * fVar123;
    auVar67 = vfmadd231ps_fma(auVar78,auVar151,auVar232);
    auVar283 = vfmadd231ps_fma(auVar202,auVar151,auVar260);
    auVar97 = vfmadd231ps_fma(auVar166,auVar151,auVar294);
    auVar125 = vfmadd231ps_fma(auVar128,auVar307,auVar151);
    auVar150 = vmovshdup_avx(auVar278._0_16_);
    fVar64 = auVar278._0_4_;
    fStack_120 = (auVar150._0_4_ - fVar64) * 0.04761905;
    auVar254._4_4_ = fVar64;
    auVar254._0_4_ = fVar64;
    auVar254._8_4_ = fVar64;
    auVar254._12_4_ = fVar64;
    auVar254._16_4_ = fVar64;
    auVar254._20_4_ = fVar64;
    auVar254._24_4_ = fVar64;
    auVar254._28_4_ = fVar64;
    auVar119._0_8_ = auVar150._0_8_;
    auVar119._8_8_ = auVar119._0_8_;
    auVar119._16_8_ = auVar119._0_8_;
    auVar119._24_8_ = auVar119._0_8_;
    auVar91 = vsubps_avx(auVar119,auVar254);
    uVar65 = auVar67._0_4_;
    auVar311._4_4_ = uVar65;
    auVar311._0_4_ = uVar65;
    auVar311._8_4_ = uVar65;
    auVar311._12_4_ = uVar65;
    auVar311._16_4_ = uVar65;
    auVar311._20_4_ = uVar65;
    auVar311._24_4_ = uVar65;
    auVar311._28_4_ = uVar65;
    auVar150 = vmovshdup_avx(auVar67);
    uVar96 = auVar150._0_8_;
    auVar302._8_8_ = uVar96;
    auVar302._0_8_ = uVar96;
    auVar302._16_8_ = uVar96;
    auVar302._24_8_ = uVar96;
    fVar207 = auVar283._0_4_;
    auVar288._4_4_ = fVar207;
    auVar288._0_4_ = fVar207;
    auVar288._8_4_ = fVar207;
    auVar288._12_4_ = fVar207;
    auVar288._16_4_ = fVar207;
    auVar288._20_4_ = fVar207;
    auVar288._24_4_ = fVar207;
    auVar288._28_4_ = fVar207;
    auVar151 = vmovshdup_avx(auVar283);
    auVar120._0_8_ = auVar151._0_8_;
    auVar120._8_8_ = auVar120._0_8_;
    auVar120._16_8_ = auVar120._0_8_;
    auVar120._24_8_ = auVar120._0_8_;
    fVar66 = auVar97._0_4_;
    auVar218._4_4_ = fVar66;
    auVar218._0_4_ = fVar66;
    auVar218._8_4_ = fVar66;
    auVar218._12_4_ = fVar66;
    auVar218._16_4_ = fVar66;
    auVar218._20_4_ = fVar66;
    auVar218._24_4_ = fVar66;
    auVar218._28_4_ = fVar66;
    auVar147 = vmovshdup_avx(auVar97);
    auVar236._0_8_ = auVar147._0_8_;
    auVar236._8_8_ = auVar236._0_8_;
    auVar236._16_8_ = auVar236._0_8_;
    auVar236._24_8_ = auVar236._0_8_;
    fVar137 = auVar125._0_4_;
    auVar69 = vmovshdup_avx(auVar125);
    auVar274 = vfmadd132ps_fma(auVar91,auVar254,_DAT_01faff20);
    auVar91 = vsubps_avx(auVar321,ZEXT1632(auVar274));
    fVar64 = auVar274._0_4_;
    fVar94 = auVar274._4_4_;
    auVar19._4_4_ = fVar207 * fVar94;
    auVar19._0_4_ = fVar207 * fVar64;
    fVar238 = auVar274._8_4_;
    auVar19._8_4_ = fVar207 * fVar238;
    fVar123 = auVar274._12_4_;
    auVar19._12_4_ = fVar207 * fVar123;
    auVar19._16_4_ = fVar207 * 0.0;
    auVar19._20_4_ = fVar207 * 0.0;
    auVar19._24_4_ = fVar207 * 0.0;
    auVar19._28_4_ = 0x3f800000;
    auVar274 = vfmadd231ps_fma(auVar19,auVar91,auVar311);
    fVar135 = auVar151._0_4_;
    fVar136 = auVar151._4_4_;
    auVar20._4_4_ = fVar136 * fVar94;
    auVar20._0_4_ = fVar135 * fVar64;
    auVar20._8_4_ = fVar135 * fVar238;
    auVar20._12_4_ = fVar136 * fVar123;
    auVar20._16_4_ = fVar135 * 0.0;
    auVar20._20_4_ = fVar136 * 0.0;
    auVar20._24_4_ = fVar135 * 0.0;
    auVar20._28_4_ = uVar65;
    auVar126 = vfmadd231ps_fma(auVar20,auVar91,auVar302);
    auVar21._4_4_ = fVar66 * fVar94;
    auVar21._0_4_ = fVar66 * fVar64;
    auVar21._8_4_ = fVar66 * fVar238;
    auVar21._12_4_ = fVar66 * fVar123;
    auVar21._16_4_ = fVar66 * 0.0;
    auVar21._20_4_ = fVar66 * 0.0;
    auVar21._24_4_ = fVar66 * 0.0;
    auVar21._28_4_ = auVar150._4_4_;
    auVar159 = vfmadd231ps_fma(auVar21,auVar91,auVar288);
    fVar135 = auVar147._0_4_;
    fVar136 = auVar147._4_4_;
    auVar13._4_4_ = fVar136 * fVar94;
    auVar13._0_4_ = fVar135 * fVar64;
    auVar13._8_4_ = fVar135 * fVar238;
    auVar13._12_4_ = fVar136 * fVar123;
    auVar13._16_4_ = fVar135 * 0.0;
    auVar13._20_4_ = fVar136 * 0.0;
    auVar13._24_4_ = fVar135 * 0.0;
    auVar13._28_4_ = fVar207;
    auVar144 = vfmadd231ps_fma(auVar13,auVar91,auVar120);
    auVar150 = vshufps_avx(auVar67,auVar67,0xaa);
    local_558._8_8_ = auVar150._0_8_;
    local_558._0_8_ = local_558._8_8_;
    local_558._16_8_ = local_558._8_8_;
    local_558._24_8_ = local_558._8_8_;
    auVar151 = vshufps_avx(auVar67,auVar67,0xff);
    uStack_600 = auVar151._0_8_;
    local_608 = (undefined1  [8])uStack_600;
    uStack_5f8 = uStack_600;
    uStack_5f0 = uStack_600;
    auVar22._4_4_ = fVar137 * fVar94;
    auVar22._0_4_ = fVar137 * fVar64;
    auVar22._8_4_ = fVar137 * fVar238;
    auVar22._12_4_ = fVar137 * fVar123;
    auVar22._16_4_ = fVar137 * 0.0;
    auVar22._20_4_ = fVar137 * 0.0;
    auVar22._24_4_ = fVar137 * 0.0;
    auVar22._28_4_ = fVar137;
    auVar67 = vfmadd231ps_fma(auVar22,auVar91,auVar218);
    auVar151 = vshufps_avx(auVar283,auVar283,0xaa);
    auVar219._0_8_ = auVar151._0_8_;
    auVar219._8_8_ = auVar219._0_8_;
    auVar219._16_8_ = auVar219._0_8_;
    auVar219._24_8_ = auVar219._0_8_;
    auVar147 = vshufps_avx(auVar283,auVar283,0xff);
    local_518._8_8_ = auVar147._0_8_;
    local_518._0_8_ = local_518._8_8_;
    local_518._16_8_ = local_518._8_8_;
    local_518._24_8_ = local_518._8_8_;
    fVar135 = auVar69._0_4_;
    fVar136 = auVar69._4_4_;
    auVar23._4_4_ = fVar136 * fVar94;
    auVar23._0_4_ = fVar135 * fVar64;
    auVar23._8_4_ = fVar135 * fVar238;
    auVar23._12_4_ = fVar136 * fVar123;
    auVar23._16_4_ = fVar135 * 0.0;
    auVar23._20_4_ = fVar136 * 0.0;
    auVar23._24_4_ = fVar135 * 0.0;
    auVar23._28_4_ = auVar150._4_4_;
    auVar188 = vfmadd231ps_fma(auVar23,auVar91,auVar236);
    auVar24._28_4_ = fVar136;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(auVar159._12_4_ * fVar123,
                            CONCAT48(auVar159._8_4_ * fVar238,
                                     CONCAT44(auVar159._4_4_ * fVar94,auVar159._0_4_ * fVar64))));
    auVar274 = vfmadd231ps_fma(auVar24,auVar91,ZEXT1632(auVar274));
    fVar135 = auVar147._4_4_;
    auVar25._28_4_ = fVar135;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(auVar144._12_4_ * fVar123,
                            CONCAT48(auVar144._8_4_ * fVar238,
                                     CONCAT44(auVar144._4_4_ * fVar94,auVar144._0_4_ * fVar64))));
    auVar126 = vfmadd231ps_fma(auVar25,auVar91,ZEXT1632(auVar126));
    auVar150 = vshufps_avx(auVar97,auVar97,0xaa);
    uVar96 = auVar150._0_8_;
    auVar206._8_8_ = uVar96;
    auVar206._0_8_ = uVar96;
    auVar206._16_8_ = uVar96;
    auVar206._24_8_ = uVar96;
    auVar69 = vshufps_avx(auVar97,auVar97,0xff);
    uVar96 = auVar69._0_8_;
    auVar322._8_8_ = uVar96;
    auVar322._0_8_ = uVar96;
    auVar322._16_8_ = uVar96;
    auVar322._24_8_ = uVar96;
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar67._12_4_ * fVar123,
                                                 CONCAT48(auVar67._8_4_ * fVar238,
                                                          CONCAT44(auVar67._4_4_ * fVar94,
                                                                   auVar67._0_4_ * fVar64)))),
                              auVar91,ZEXT1632(auVar159));
    auVar67 = vshufps_avx(auVar125,auVar125,0xaa);
    auVar283 = vshufps_avx(auVar125,auVar125,0xff);
    auVar125 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar188._12_4_,
                                                  CONCAT48(fVar238 * auVar188._8_4_,
                                                           CONCAT44(fVar94 * auVar188._4_4_,
                                                                    fVar64 * auVar188._0_4_)))),
                               auVar91,ZEXT1632(auVar144));
    auVar159 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar97._12_4_,
                                                  CONCAT48(fVar238 * auVar97._8_4_,
                                                           CONCAT44(fVar94 * auVar97._4_4_,
                                                                    fVar64 * auVar97._0_4_)))),
                               auVar91,ZEXT1632(auVar274));
    auVar19 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar274));
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar125._12_4_,
                                                 CONCAT48(fVar238 * auVar125._8_4_,
                                                          CONCAT44(fVar94 * auVar125._4_4_,
                                                                   fVar64 * auVar125._0_4_)))),
                              auVar91,ZEXT1632(auVar126));
    auVar20 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar126));
    fStack_45c = auVar20._28_4_;
    auVar289._0_4_ = fStack_120 * auVar19._0_4_ * 3.0;
    auVar289._4_4_ = fStack_120 * auVar19._4_4_ * 3.0;
    auVar289._8_4_ = fStack_120 * auVar19._8_4_ * 3.0;
    auVar289._12_4_ = fStack_120 * auVar19._12_4_ * 3.0;
    auVar289._16_4_ = fStack_120 * auVar19._16_4_ * 3.0;
    auVar289._20_4_ = fStack_120 * auVar19._20_4_ * 3.0;
    auVar289._24_4_ = fStack_120 * auVar19._24_4_ * 3.0;
    auVar289._28_4_ = 0;
    local_478._0_4_ = fStack_120 * auVar20._0_4_ * 3.0;
    local_478._4_4_ = fStack_120 * auVar20._4_4_ * 3.0;
    fStack_470 = fStack_120 * auVar20._8_4_ * 3.0;
    fStack_46c = fStack_120 * auVar20._12_4_ * 3.0;
    fStack_468 = fStack_120 * auVar20._16_4_ * 3.0;
    fStack_464 = fStack_120 * auVar20._20_4_ * 3.0;
    fStack_460 = fStack_120 * auVar20._24_4_ * 3.0;
    fVar136 = auVar151._0_4_;
    fVar137 = auVar151._4_4_;
    auVar290._4_4_ = fVar137 * fVar94;
    auVar290._0_4_ = fVar136 * fVar64;
    auVar290._8_4_ = fVar136 * fVar238;
    auVar290._12_4_ = fVar137 * fVar123;
    auVar290._16_4_ = fVar136 * 0.0;
    auVar290._20_4_ = fVar137 * 0.0;
    auVar290._24_4_ = fVar136 * 0.0;
    auVar290._28_4_ = fStack_45c;
    auVar151 = vfmadd231ps_fma(auVar290,auVar91,local_558);
    fVar136 = auVar147._0_4_;
    auVar27._4_4_ = fVar135 * fVar94;
    auVar27._0_4_ = fVar136 * fVar64;
    auVar27._8_4_ = fVar136 * fVar238;
    auVar27._12_4_ = fVar135 * fVar123;
    auVar27._16_4_ = fVar136 * 0.0;
    auVar27._20_4_ = fVar135 * 0.0;
    auVar27._24_4_ = fVar136 * 0.0;
    auVar27._28_4_ = 0;
    auVar147 = vfmadd231ps_fma(auVar27,auVar91,_local_608);
    fVar135 = auVar150._0_4_;
    fVar136 = auVar150._4_4_;
    auVar28._4_4_ = fVar136 * fVar94;
    auVar28._0_4_ = fVar135 * fVar64;
    auVar28._8_4_ = fVar135 * fVar238;
    auVar28._12_4_ = fVar136 * fVar123;
    auVar28._16_4_ = fVar135 * 0.0;
    auVar28._20_4_ = fVar136 * 0.0;
    auVar28._24_4_ = fVar135 * 0.0;
    auVar28._28_4_ = auVar19._28_4_;
    auVar150 = vfmadd231ps_fma(auVar28,auVar91,auVar219);
    fVar135 = auVar69._0_4_;
    fVar66 = auVar69._4_4_;
    auVar29._4_4_ = fVar66 * fVar94;
    auVar29._0_4_ = fVar135 * fVar64;
    auVar29._8_4_ = fVar135 * fVar238;
    auVar29._12_4_ = fVar66 * fVar123;
    auVar29._16_4_ = fVar135 * 0.0;
    auVar29._20_4_ = fVar66 * 0.0;
    auVar29._24_4_ = fVar135 * 0.0;
    auVar29._28_4_ = fVar137;
    auVar69 = vfmadd231ps_fma(auVar29,auVar91,local_518);
    auVar22 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar159));
    fVar135 = auVar67._0_4_;
    fVar136 = auVar67._4_4_;
    auVar30._4_4_ = fVar136 * fVar94;
    auVar30._0_4_ = fVar135 * fVar64;
    auVar30._8_4_ = fVar135 * fVar238;
    auVar30._12_4_ = fVar136 * fVar123;
    auVar30._16_4_ = fVar135 * 0.0;
    auVar30._20_4_ = fVar136 * 0.0;
    auVar30._24_4_ = fVar135 * 0.0;
    auVar30._28_4_ = fVar136;
    auVar67 = vfmadd231ps_fma(auVar30,auVar91,auVar206);
    auVar23 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar97));
    fVar135 = auVar283._0_4_;
    fVar136 = auVar283._4_4_;
    auVar31._4_4_ = fVar136 * fVar94;
    auVar31._0_4_ = fVar135 * fVar64;
    auVar31._8_4_ = fVar135 * fVar238;
    auVar31._12_4_ = fVar136 * fVar123;
    auVar31._16_4_ = fVar135 * 0.0;
    auVar31._20_4_ = fVar136 * 0.0;
    auVar31._24_4_ = fVar135 * 0.0;
    auVar31._28_4_ = fVar136;
    auVar283 = vfmadd231ps_fma(auVar31,auVar91,auVar322);
    auVar32._28_4_ = fVar66;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(auVar150._12_4_ * fVar123,
                            CONCAT48(auVar150._8_4_ * fVar238,
                                     CONCAT44(auVar150._4_4_ * fVar94,auVar150._0_4_ * fVar64))));
    auVar151 = vfmadd231ps_fma(auVar32,auVar91,ZEXT1632(auVar151));
    auVar147 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar69._12_4_,
                                                  CONCAT48(fVar238 * auVar69._8_4_,
                                                           CONCAT44(fVar94 * auVar69._4_4_,
                                                                    fVar64 * auVar69._0_4_)))),
                               auVar91,ZEXT1632(auVar147));
    auVar121._0_4_ = auVar159._0_4_ + auVar289._0_4_;
    auVar121._4_4_ = auVar159._4_4_ + auVar289._4_4_;
    auVar121._8_4_ = auVar159._8_4_ + auVar289._8_4_;
    auVar121._12_4_ = auVar159._12_4_ + auVar289._12_4_;
    auVar121._16_4_ = auVar289._16_4_ + 0.0;
    auVar121._20_4_ = auVar289._20_4_ + 0.0;
    auVar121._24_4_ = auVar289._24_4_ + 0.0;
    auVar121._28_4_ = 0;
    auVar150 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar67._12_4_ * fVar123,
                                                  CONCAT48(auVar67._8_4_ * fVar238,
                                                           CONCAT44(auVar67._4_4_ * fVar94,
                                                                    auVar67._0_4_ * fVar64)))),
                               auVar91,ZEXT1632(auVar150));
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar283._12_4_ * fVar123,
                                                 CONCAT48(auVar283._8_4_ * fVar238,
                                                          CONCAT44(auVar283._4_4_ * fVar94,
                                                                   auVar283._0_4_ * fVar64)))),
                              auVar91,ZEXT1632(auVar69));
    auVar67 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar150._12_4_,
                                                 CONCAT48(fVar238 * auVar150._8_4_,
                                                          CONCAT44(fVar94 * auVar150._4_4_,
                                                                   fVar64 * auVar150._0_4_)))),
                              auVar91,ZEXT1632(auVar151));
    auVar283 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar69._12_4_ * fVar123,
                                                  CONCAT48(auVar69._8_4_ * fVar238,
                                                           CONCAT44(auVar69._4_4_ * fVar94,
                                                                    auVar69._0_4_ * fVar64)))),
                               ZEXT1632(auVar147),auVar91);
    auVar91 = vsubps_avx(ZEXT1632(auVar150),ZEXT1632(auVar151));
    auVar19 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar147));
    auVar312._0_4_ = fStack_120 * auVar91._0_4_ * 3.0;
    auVar312._4_4_ = fStack_120 * auVar91._4_4_ * 3.0;
    auVar312._8_4_ = fStack_120 * auVar91._8_4_ * 3.0;
    auVar312._12_4_ = fStack_120 * auVar91._12_4_ * 3.0;
    auVar312._16_4_ = fStack_120 * auVar91._16_4_ * 3.0;
    auVar312._20_4_ = fStack_120 * auVar91._20_4_ * 3.0;
    auVar312._24_4_ = fStack_120 * auVar91._24_4_ * 3.0;
    auVar312._28_4_ = 0;
    local_138 = fStack_120 * auVar19._0_4_ * 3.0;
    fStack_134 = fStack_120 * auVar19._4_4_ * 3.0;
    auVar33._4_4_ = fStack_134;
    auVar33._0_4_ = local_138;
    fStack_130 = fStack_120 * auVar19._8_4_ * 3.0;
    auVar33._8_4_ = fStack_130;
    fStack_12c = fStack_120 * auVar19._12_4_ * 3.0;
    auVar33._12_4_ = fStack_12c;
    fStack_128 = fStack_120 * auVar19._16_4_ * 3.0;
    auVar33._16_4_ = fStack_128;
    fStack_124 = fStack_120 * auVar19._20_4_ * 3.0;
    auVar33._20_4_ = fStack_124;
    fStack_120 = fStack_120 * auVar19._24_4_ * 3.0;
    auVar33._24_4_ = fStack_120;
    auVar33._28_4_ = 0x40400000;
    auVar24 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar67));
    local_438 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar283));
    auVar91 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar159));
    auVar19 = vsubps_avx(ZEXT1632(auVar283),ZEXT1632(auVar97));
    auVar20 = vsubps_avx(auVar24,auVar22);
    fVar207 = auVar91._0_4_ + auVar20._0_4_;
    fVar221 = auVar91._4_4_ + auVar20._4_4_;
    fVar222 = auVar91._8_4_ + auVar20._8_4_;
    fVar223 = auVar91._12_4_ + auVar20._12_4_;
    fVar224 = auVar91._16_4_ + auVar20._16_4_;
    fVar225 = auVar91._20_4_ + auVar20._20_4_;
    fVar226 = auVar91._24_4_ + auVar20._24_4_;
    auVar21 = vsubps_avx(local_438,auVar23);
    auVar92._0_4_ = auVar19._0_4_ + auVar21._0_4_;
    auVar92._4_4_ = auVar19._4_4_ + auVar21._4_4_;
    auVar92._8_4_ = auVar19._8_4_ + auVar21._8_4_;
    auVar92._12_4_ = auVar19._12_4_ + auVar21._12_4_;
    auVar92._16_4_ = auVar19._16_4_ + auVar21._16_4_;
    auVar92._20_4_ = auVar19._20_4_ + auVar21._20_4_;
    auVar92._24_4_ = auVar19._24_4_ + auVar21._24_4_;
    auVar92._28_4_ = auVar19._28_4_ + auVar21._28_4_;
    local_d8 = ZEXT1632(auVar97);
    fVar64 = auVar97._0_4_;
    local_158 = (float)local_478._0_4_ + fVar64;
    fVar94 = auVar97._4_4_;
    fStack_154 = (float)local_478._4_4_ + fVar94;
    fVar238 = auVar97._8_4_;
    fStack_150 = fStack_470 + fVar238;
    fVar123 = auVar97._12_4_;
    fStack_14c = fStack_46c + fVar123;
    fStack_148 = fStack_468 + 0.0;
    fStack_144 = fStack_464 + 0.0;
    fStack_140 = fStack_460 + 0.0;
    local_98 = ZEXT1632(auVar159);
    auVar19 = vsubps_avx(local_98,auVar289);
    local_b8 = vpermps_avx2(_DAT_01fec480,auVar19);
    auVar19 = vsubps_avx(local_d8,_local_478);
    local_178 = vpermps_avx2(_DAT_01fec480,auVar19);
    local_f8._0_4_ = auVar67._0_4_ + auVar312._0_4_;
    local_f8._4_4_ = auVar67._4_4_ + auVar312._4_4_;
    local_f8._8_4_ = auVar67._8_4_ + auVar312._8_4_;
    local_f8._12_4_ = auVar67._12_4_ + auVar312._12_4_;
    local_f8._16_4_ = auVar312._16_4_ + 0.0;
    local_f8._20_4_ = auVar312._20_4_ + 0.0;
    local_f8._24_4_ = auVar312._24_4_ + 0.0;
    local_f8._28_4_ = 0;
    auVar290 = ZEXT1632(auVar67);
    auVar19 = vsubps_avx(auVar290,auVar312);
    auVar25 = vpermps_avx2(_DAT_01fec480,auVar19);
    fVar135 = auVar283._0_4_;
    local_138 = fVar135 + local_138;
    fVar136 = auVar283._4_4_;
    fStack_134 = fVar136 + fStack_134;
    fVar137 = auVar283._8_4_;
    fStack_130 = fVar137 + fStack_130;
    fVar66 = auVar283._12_4_;
    fStack_12c = fVar66 + fStack_12c;
    fStack_128 = fStack_128 + 0.0;
    fStack_124 = fStack_124 + 0.0;
    fStack_120 = fStack_120 + 0.0;
    auVar19 = vsubps_avx(ZEXT1632(auVar283),auVar33);
    local_118 = vpermps_avx2(_DAT_01fec480,auVar19);
    auVar34._4_4_ = fVar94 * fVar221;
    auVar34._0_4_ = fVar64 * fVar207;
    auVar34._8_4_ = fVar238 * fVar222;
    auVar34._12_4_ = fVar123 * fVar223;
    auVar34._16_4_ = fVar224 * 0.0;
    auVar34._20_4_ = fVar225 * 0.0;
    auVar34._24_4_ = fVar226 * 0.0;
    auVar34._28_4_ = auVar19._28_4_;
    auVar150 = vfnmadd231ps_fma(auVar34,local_98,auVar92);
    fStack_13c = fStack_45c + 0.0;
    auVar35._4_4_ = fStack_154 * fVar221;
    auVar35._0_4_ = local_158 * fVar207;
    auVar35._8_4_ = fStack_150 * fVar222;
    auVar35._12_4_ = fStack_14c * fVar223;
    auVar35._16_4_ = fStack_148 * fVar224;
    auVar35._20_4_ = fStack_144 * fVar225;
    auVar35._24_4_ = fStack_140 * fVar226;
    auVar35._28_4_ = 0;
    auVar151 = vfnmadd231ps_fma(auVar35,auVar92,auVar121);
    auVar36._4_4_ = local_178._4_4_ * fVar221;
    auVar36._0_4_ = local_178._0_4_ * fVar207;
    auVar36._8_4_ = local_178._8_4_ * fVar222;
    auVar36._12_4_ = local_178._12_4_ * fVar223;
    auVar36._16_4_ = local_178._16_4_ * fVar224;
    auVar36._20_4_ = local_178._20_4_ * fVar225;
    auVar36._24_4_ = local_178._24_4_ * fVar226;
    auVar36._28_4_ = fStack_45c + 0.0;
    auVar147 = vfnmadd231ps_fma(auVar36,local_b8,auVar92);
    local_608._0_4_ = auVar23._0_4_;
    local_608._4_4_ = auVar23._4_4_;
    uStack_600._0_4_ = auVar23._8_4_;
    uStack_600._4_4_ = auVar23._12_4_;
    uStack_5f8._0_4_ = auVar23._16_4_;
    uStack_5f8._4_4_ = auVar23._20_4_;
    uStack_5f0._0_4_ = auVar23._24_4_;
    uStack_5f0._4_4_ = auVar23._28_4_;
    auVar37._4_4_ = (float)local_608._4_4_ * fVar221;
    auVar37._0_4_ = (float)local_608._0_4_ * fVar207;
    auVar37._8_4_ = (float)uStack_600 * fVar222;
    auVar37._12_4_ = uStack_600._4_4_ * fVar223;
    auVar37._16_4_ = (float)uStack_5f8 * fVar224;
    auVar37._20_4_ = uStack_5f8._4_4_ * fVar225;
    auVar37._24_4_ = (float)uStack_5f0 * fVar226;
    auVar37._28_4_ = uStack_5f0._4_4_;
    auVar69 = vfnmadd231ps_fma(auVar37,auVar22,auVar92);
    auVar237._0_4_ = fVar135 * fVar207;
    auVar237._4_4_ = fVar136 * fVar221;
    auVar237._8_4_ = fVar137 * fVar222;
    auVar237._12_4_ = fVar66 * fVar223;
    auVar237._16_4_ = fVar224 * 0.0;
    auVar237._20_4_ = fVar225 * 0.0;
    auVar237._24_4_ = fVar226 * 0.0;
    auVar237._28_4_ = 0;
    auVar67 = vfnmadd231ps_fma(auVar237,auVar290,auVar92);
    uStack_11c = 0x40400000;
    auVar38._4_4_ = fStack_134 * fVar221;
    auVar38._0_4_ = local_138 * fVar207;
    auVar38._8_4_ = fStack_130 * fVar222;
    auVar38._12_4_ = fStack_12c * fVar223;
    auVar38._16_4_ = fStack_128 * fVar224;
    auVar38._20_4_ = fStack_124 * fVar225;
    auVar38._24_4_ = fStack_120 * fVar226;
    auVar38._28_4_ = auVar22._28_4_;
    auVar97 = vfnmadd231ps_fma(auVar38,local_f8,auVar92);
    auVar39._4_4_ = local_118._4_4_ * fVar221;
    auVar39._0_4_ = local_118._0_4_ * fVar207;
    auVar39._8_4_ = local_118._8_4_ * fVar222;
    auVar39._12_4_ = local_118._12_4_ * fVar223;
    auVar39._16_4_ = local_118._16_4_ * fVar224;
    auVar39._20_4_ = local_118._20_4_ * fVar225;
    auVar39._24_4_ = local_118._24_4_ * fVar226;
    auVar39._28_4_ = local_118._28_4_;
    auVar125 = vfnmadd231ps_fma(auVar39,auVar25,auVar92);
    auVar40._4_4_ = local_438._4_4_ * fVar221;
    auVar40._0_4_ = local_438._0_4_ * fVar207;
    auVar40._8_4_ = local_438._8_4_ * fVar222;
    auVar40._12_4_ = local_438._12_4_ * fVar223;
    auVar40._16_4_ = local_438._16_4_ * fVar224;
    auVar40._20_4_ = local_438._20_4_ * fVar225;
    auVar40._24_4_ = local_438._24_4_ * fVar226;
    auVar40._28_4_ = auVar91._28_4_ + auVar20._28_4_;
    auVar274 = vfnmadd231ps_fma(auVar40,auVar24,auVar92);
    auVar19 = vminps_avx(ZEXT1632(auVar150),ZEXT1632(auVar151));
    auVar91 = vmaxps_avx(ZEXT1632(auVar150),ZEXT1632(auVar151));
    auVar20 = vminps_avx(ZEXT1632(auVar147),ZEXT1632(auVar69));
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(ZEXT1632(auVar147),ZEXT1632(auVar69));
    auVar91 = vmaxps_avx(auVar91,auVar19);
    auVar21 = vminps_avx(ZEXT1632(auVar67),ZEXT1632(auVar97));
    auVar19 = vmaxps_avx(ZEXT1632(auVar67),ZEXT1632(auVar97));
    auVar13 = vminps_avx(ZEXT1632(auVar125),ZEXT1632(auVar274));
    auVar21 = vminps_avx(auVar21,auVar13);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(ZEXT1632(auVar125),ZEXT1632(auVar274));
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar91,auVar19);
    auVar49._4_4_ = fStack_264;
    auVar49._0_4_ = local_268;
    auVar49._8_4_ = fStack_260;
    auVar49._12_4_ = fStack_25c;
    auVar49._16_4_ = fStack_258;
    auVar49._20_4_ = fStack_254;
    auVar49._24_4_ = fStack_250;
    auVar49._28_4_ = fStack_24c;
    auVar91 = vcmpps_avx(auVar21,auVar49,2);
    auVar51._4_4_ = fStack_74;
    auVar51._0_4_ = local_78;
    auVar51._8_4_ = fStack_70;
    auVar51._12_4_ = fStack_6c;
    auVar51._16_4_ = fStack_68;
    auVar51._20_4_ = fStack_64;
    auVar51._24_4_ = fStack_60;
    auVar51._28_4_ = fStack_5c;
    auVar19 = vcmpps_avx(auVar19,auVar51,5);
    auVar91 = vandps_avx(auVar19,auVar91);
    auVar19 = local_198 & auVar91;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar19 = vsubps_avx(auVar22,local_98);
      auVar20 = vsubps_avx(auVar24,auVar290);
      fVar221 = auVar19._0_4_ + auVar20._0_4_;
      fVar222 = auVar19._4_4_ + auVar20._4_4_;
      fVar223 = auVar19._8_4_ + auVar20._8_4_;
      fVar224 = auVar19._12_4_ + auVar20._12_4_;
      fVar225 = auVar19._16_4_ + auVar20._16_4_;
      fVar226 = auVar19._20_4_ + auVar20._20_4_;
      fVar95 = auVar19._24_4_ + auVar20._24_4_;
      auVar21 = vsubps_avx(auVar23,local_d8);
      auVar13 = vsubps_avx(local_438,ZEXT1632(auVar283));
      auVar122._0_4_ = auVar21._0_4_ + auVar13._0_4_;
      auVar122._4_4_ = auVar21._4_4_ + auVar13._4_4_;
      auVar122._8_4_ = auVar21._8_4_ + auVar13._8_4_;
      auVar122._12_4_ = auVar21._12_4_ + auVar13._12_4_;
      auVar122._16_4_ = auVar21._16_4_ + auVar13._16_4_;
      auVar122._20_4_ = auVar21._20_4_ + auVar13._20_4_;
      auVar122._24_4_ = auVar21._24_4_ + auVar13._24_4_;
      fVar207 = auVar13._28_4_;
      auVar122._28_4_ = auVar21._28_4_ + fVar207;
      auVar41._4_4_ = fVar94 * fVar222;
      auVar41._0_4_ = fVar64 * fVar221;
      auVar41._8_4_ = fVar238 * fVar223;
      auVar41._12_4_ = fVar123 * fVar224;
      auVar41._16_4_ = fVar225 * 0.0;
      auVar41._20_4_ = fVar226 * 0.0;
      auVar41._24_4_ = fVar95 * 0.0;
      auVar41._28_4_ = auVar24._28_4_;
      auVar67 = vfnmadd231ps_fma(auVar41,auVar122,local_98);
      auVar42._4_4_ = fVar222 * fStack_154;
      auVar42._0_4_ = fVar221 * local_158;
      auVar42._8_4_ = fVar223 * fStack_150;
      auVar42._12_4_ = fVar224 * fStack_14c;
      auVar42._16_4_ = fVar225 * fStack_148;
      auVar42._20_4_ = fVar226 * fStack_144;
      auVar42._24_4_ = fVar95 * fStack_140;
      auVar42._28_4_ = 0;
      auVar150 = vfnmadd213ps_fma(auVar121,auVar122,auVar42);
      auVar43._4_4_ = fVar222 * local_178._4_4_;
      auVar43._0_4_ = fVar221 * local_178._0_4_;
      auVar43._8_4_ = fVar223 * local_178._8_4_;
      auVar43._12_4_ = fVar224 * local_178._12_4_;
      auVar43._16_4_ = fVar225 * local_178._16_4_;
      auVar43._20_4_ = fVar226 * local_178._20_4_;
      auVar43._24_4_ = fVar95 * local_178._24_4_;
      auVar43._28_4_ = 0;
      auVar151 = vfnmadd213ps_fma(local_b8,auVar122,auVar43);
      auVar44._4_4_ = (float)local_608._4_4_ * fVar222;
      auVar44._0_4_ = (float)local_608._0_4_ * fVar221;
      auVar44._8_4_ = (float)uStack_600 * fVar223;
      auVar44._12_4_ = uStack_600._4_4_ * fVar224;
      auVar44._16_4_ = (float)uStack_5f8 * fVar225;
      auVar44._20_4_ = uStack_5f8._4_4_ * fVar226;
      auVar44._24_4_ = (float)uStack_5f0 * fVar95;
      auVar44._28_4_ = 0;
      auVar283 = vfnmadd231ps_fma(auVar44,auVar122,auVar22);
      auVar152._0_4_ = fVar135 * fVar221;
      auVar152._4_4_ = fVar136 * fVar222;
      auVar152._8_4_ = fVar137 * fVar223;
      auVar152._12_4_ = fVar66 * fVar224;
      auVar152._16_4_ = fVar225 * 0.0;
      auVar152._20_4_ = fVar226 * 0.0;
      auVar152._24_4_ = fVar95 * 0.0;
      auVar152._28_4_ = 0;
      auVar97 = vfnmadd231ps_fma(auVar152,auVar122,auVar290);
      auVar45._4_4_ = fVar222 * fStack_134;
      auVar45._0_4_ = fVar221 * local_138;
      auVar45._8_4_ = fVar223 * fStack_130;
      auVar45._12_4_ = fVar224 * fStack_12c;
      auVar45._16_4_ = fVar225 * fStack_128;
      auVar45._20_4_ = fVar226 * fStack_124;
      auVar45._24_4_ = fVar95 * fStack_120;
      auVar45._28_4_ = fVar207;
      auVar147 = vfnmadd213ps_fma(local_f8,auVar122,auVar45);
      auVar46._4_4_ = fVar222 * local_118._4_4_;
      auVar46._0_4_ = fVar221 * local_118._0_4_;
      auVar46._8_4_ = fVar223 * local_118._8_4_;
      auVar46._12_4_ = fVar224 * local_118._12_4_;
      auVar46._16_4_ = fVar225 * local_118._16_4_;
      auVar46._20_4_ = fVar226 * local_118._20_4_;
      auVar46._24_4_ = fVar95 * local_118._24_4_;
      auVar46._28_4_ = fVar207;
      auVar69 = vfnmadd213ps_fma(auVar25,auVar122,auVar46);
      auVar47._4_4_ = fVar222 * local_438._4_4_;
      auVar47._0_4_ = fVar221 * local_438._0_4_;
      auVar47._8_4_ = fVar223 * local_438._8_4_;
      auVar47._12_4_ = fVar224 * local_438._12_4_;
      auVar47._16_4_ = fVar225 * local_438._16_4_;
      auVar47._20_4_ = fVar226 * local_438._20_4_;
      auVar47._24_4_ = fVar95 * local_438._24_4_;
      auVar47._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar125 = vfnmadd231ps_fma(auVar47,auVar122,auVar24);
      auVar20 = vminps_avx(ZEXT1632(auVar67),ZEXT1632(auVar150));
      auVar19 = vmaxps_avx(ZEXT1632(auVar67),ZEXT1632(auVar150));
      auVar21 = vminps_avx(ZEXT1632(auVar151),ZEXT1632(auVar283));
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(ZEXT1632(auVar151),ZEXT1632(auVar283));
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar13 = vminps_avx(ZEXT1632(auVar97),ZEXT1632(auVar147));
      auVar20 = vmaxps_avx(ZEXT1632(auVar97),ZEXT1632(auVar147));
      auVar22 = vminps_avx(ZEXT1632(auVar69),ZEXT1632(auVar125));
      auVar13 = vminps_avx(auVar13,auVar22);
      auVar13 = vminps_avx(auVar21,auVar13);
      auVar21 = vmaxps_avx(ZEXT1632(auVar69),ZEXT1632(auVar125));
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar50._4_4_ = fStack_264;
      auVar50._0_4_ = local_268;
      auVar50._8_4_ = fStack_260;
      auVar50._12_4_ = fStack_25c;
      auVar50._16_4_ = fStack_258;
      auVar50._20_4_ = fStack_254;
      auVar50._24_4_ = fStack_250;
      auVar50._28_4_ = fStack_24c;
      auVar19 = vcmpps_avx(auVar13,auVar50,2);
      auVar20 = vcmpps_avx(auVar20,auVar51,5);
      auVar19 = vandps_avx(auVar20,auVar19);
      auVar91 = vandps_avx(auVar91,local_198);
      auVar20 = auVar91 & auVar19;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar91 = vandps_avx(auVar19,auVar91);
        uVar59 = vmovmskps_avx(auVar91);
        if (uVar59 != 0) {
          uVar55 = (ulong)uVar61;
          auStack_388[uVar55] = uVar59 & 0xff;
          uVar96 = vmovlps_avx(local_308);
          *(undefined8 *)(&uStack_248 + uVar55 * 2) = uVar96;
          uVar54 = vmovlps_avx(auVar176);
          auStack_58[uVar55] = uVar54;
          uVar61 = uVar61 + 1;
        }
      }
    }
    if (uVar61 != 0) {
      do {
        uVar55 = (ulong)(uVar61 - 1);
        uVar58 = auStack_388[uVar55];
        uVar59 = (&uStack_248)[uVar55 * 2];
        fVar64 = afStack_244[uVar55 * 2];
        iVar26 = 0;
        for (uVar54 = (ulong)uVar58; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
          iVar26 = iVar26 + 1;
        }
        uVar58 = uVar58 - 1 & uVar58;
        if (uVar58 == 0) {
          uVar61 = uVar61 - 1;
        }
        auVar177._8_8_ = 0;
        auVar177._0_8_ = auStack_58[uVar55];
        auVar187 = ZEXT1664(auVar177);
        auStack_388[uVar55] = uVar58;
        fVar94 = (float)(iVar26 + 1) * 0.14285715;
        auVar150 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * (float)iVar26 * 0.14285715)),
                                   ZEXT416(uVar59),ZEXT416((uint)(1.0 - (float)iVar26 * 0.14285715))
                                  );
        auVar151 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * fVar94)),ZEXT416(uVar59),
                                   ZEXT416((uint)(1.0 - fVar94)));
        fVar94 = auVar151._0_4_;
        fVar238 = auVar150._0_4_;
        fVar64 = fVar94 - fVar238;
        if (0.16666667 <= fVar64) {
          auVar150 = vinsertps_avx(auVar150,auVar151,0x10);
          auVar278 = ZEXT1664(auVar150);
          goto LAB_016ad969;
        }
        auVar147 = vshufps_avx(auVar177,auVar177,0x50);
        auVar109._8_4_ = 0x3f800000;
        auVar109._0_8_ = 0x3f8000003f800000;
        auVar109._12_4_ = 0x3f800000;
        auVar69 = vsubps_avx(auVar109,auVar147);
        fVar123 = auVar147._0_4_;
        auVar167._0_4_ = fVar123 * fVar138;
        fVar135 = auVar147._4_4_;
        auVar167._4_4_ = fVar135 * fVar154;
        fVar136 = auVar147._8_4_;
        auVar167._8_4_ = fVar136 * fVar138;
        fVar137 = auVar147._12_4_;
        auVar167._12_4_ = fVar137 * fVar154;
        auVar178._0_4_ = fVar155 * fVar123;
        auVar178._4_4_ = fVar156 * fVar135;
        auVar178._8_4_ = fVar155 * fVar136;
        auVar178._12_4_ = fVar156 * fVar137;
        auVar203._0_4_ = fVar157 * fVar123;
        auVar203._4_4_ = fVar158 * fVar135;
        auVar203._8_4_ = fVar157 * fVar136;
        auVar203._12_4_ = fVar158 * fVar137;
        auVar79._0_4_ = fVar239 * fVar123;
        auVar79._4_4_ = fVar255 * fVar135;
        auVar79._8_4_ = fVar239 * fVar136;
        auVar79._12_4_ = fVar255 * fVar137;
        auVar147 = vfmadd231ps_fma(auVar167,auVar69,auVar232);
        auVar67 = vfmadd231ps_fma(auVar178,auVar69,auVar260);
        auVar283 = vfmadd231ps_fma(auVar203,auVar69,auVar294);
        auVar69 = vfmadd231ps_fma(auVar79,auVar69,auVar307);
        auVar153._16_16_ = auVar147;
        auVar153._0_16_ = auVar147;
        auVar172._16_16_ = auVar67;
        auVar172._0_16_ = auVar67;
        auVar186._16_16_ = auVar283;
        auVar186._0_16_ = auVar283;
        auVar220._4_4_ = fVar238;
        auVar220._0_4_ = fVar238;
        auVar220._8_4_ = fVar238;
        auVar220._12_4_ = fVar238;
        auVar220._20_4_ = fVar94;
        auVar220._16_4_ = fVar94;
        auVar220._24_4_ = fVar94;
        auVar220._28_4_ = fVar94;
        auVar91 = vsubps_avx(auVar172,auVar153);
        auVar67 = vfmadd213ps_fma(auVar91,auVar220,auVar153);
        auVar91 = vsubps_avx(auVar186,auVar172);
        auVar97 = vfmadd213ps_fma(auVar91,auVar220,auVar172);
        auVar147 = vsubps_avx(auVar69,auVar283);
        auVar93._16_16_ = auVar147;
        auVar93._0_16_ = auVar147;
        auVar147 = vfmadd213ps_fma(auVar93,auVar220,auVar186);
        auVar91 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar67));
        auVar69 = vfmadd213ps_fma(auVar91,auVar220,ZEXT1632(auVar67));
        auVar91 = vsubps_avx(ZEXT1632(auVar147),ZEXT1632(auVar97));
        auVar147 = vfmadd213ps_fma(auVar91,auVar220,ZEXT1632(auVar97));
        auVar91 = vsubps_avx(ZEXT1632(auVar147),ZEXT1632(auVar69));
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar91,auVar220);
        fVar123 = fVar64 * 0.33333334;
        auVar110._0_8_ =
             CONCAT44(auVar126._4_4_ + fVar123 * auVar91._4_4_ * 3.0,
                      auVar126._0_4_ + fVar123 * auVar91._0_4_ * 3.0);
        auVar110._8_4_ = auVar126._8_4_ + fVar123 * auVar91._8_4_ * 3.0;
        auVar110._12_4_ = auVar126._12_4_ + fVar123 * auVar91._12_4_ * 3.0;
        auVar69 = vshufpd_avx(auVar126,auVar126,3);
        auVar67 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar147 = vsubps_avx(auVar69,auVar126);
        auVar283 = vsubps_avx(auVar67,(undefined1  [16])0x0);
        auVar80._0_4_ = auVar147._0_4_ + auVar283._0_4_;
        auVar80._4_4_ = auVar147._4_4_ + auVar283._4_4_;
        auVar80._8_4_ = auVar147._8_4_ + auVar283._8_4_;
        auVar80._12_4_ = auVar147._12_4_ + auVar283._12_4_;
        auVar147 = vshufps_avx(auVar126,auVar126,0xb1);
        auVar283 = vshufps_avx(auVar110,auVar110,0xb1);
        auVar308._4_4_ = auVar80._0_4_;
        auVar308._0_4_ = auVar80._0_4_;
        auVar308._8_4_ = auVar80._0_4_;
        auVar308._12_4_ = auVar80._0_4_;
        auVar97 = vshufps_avx(auVar80,auVar80,0x55);
        fVar135 = auVar97._0_4_;
        auVar81._0_4_ = fVar135 * auVar147._0_4_;
        fVar136 = auVar97._4_4_;
        auVar81._4_4_ = fVar136 * auVar147._4_4_;
        fVar137 = auVar97._8_4_;
        auVar81._8_4_ = fVar137 * auVar147._8_4_;
        fVar66 = auVar97._12_4_;
        auVar81._12_4_ = fVar66 * auVar147._12_4_;
        auVar179._0_4_ = fVar135 * auVar283._0_4_;
        auVar179._4_4_ = fVar136 * auVar283._4_4_;
        auVar179._8_4_ = fVar137 * auVar283._8_4_;
        auVar179._12_4_ = fVar66 * auVar283._12_4_;
        auVar125 = vfmadd231ps_fma(auVar81,auVar308,auVar126);
        local_438._0_16_ = auVar110;
        auVar274 = vfmadd231ps_fma(auVar179,auVar308,auVar110);
        auVar283 = vshufps_avx(auVar125,auVar125,0xe8);
        auVar97 = vshufps_avx(auVar274,auVar274,0xe8);
        auVar147 = vcmpps_avx(auVar283,auVar97,1);
        uVar59 = vextractps_avx(auVar147,0);
        auVar159 = auVar274;
        if ((uVar59 & 1) == 0) {
          auVar159 = auVar125;
        }
        auVar143._0_4_ = fVar123 * auVar91._16_4_ * 3.0;
        auVar143._4_4_ = fVar123 * auVar91._20_4_ * 3.0;
        auVar143._8_4_ = fVar123 * auVar91._24_4_ * 3.0;
        auVar143._12_4_ = fVar123 * 0.0;
        auVar208 = vsubps_avx((undefined1  [16])0x0,auVar143);
        auVar144 = vshufps_avx(auVar208,auVar208,0xb1);
        auVar188 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar214._0_4_ = fVar135 * auVar144._0_4_;
        auVar214._4_4_ = fVar136 * auVar144._4_4_;
        auVar214._8_4_ = fVar137 * auVar144._8_4_;
        auVar214._12_4_ = fVar66 * auVar144._12_4_;
        auVar233._0_4_ = auVar188._0_4_ * fVar135;
        auVar233._4_4_ = auVar188._4_4_ * fVar136;
        auVar233._8_4_ = auVar188._8_4_ * fVar137;
        auVar233._12_4_ = auVar188._12_4_ * fVar66;
        auVar209 = vfmadd231ps_fma(auVar214,auVar308,auVar208);
        auVar227 = vfmadd231ps_fma(auVar233,(undefined1  [16])0x0,auVar308);
        auVar188 = vshufps_avx(auVar209,auVar209,0xe8);
        auVar176 = vshufps_avx(auVar227,auVar227,0xe8);
        auVar144 = vcmpps_avx(auVar188,auVar176,1);
        uVar59 = vextractps_avx(auVar144,0);
        auVar228 = auVar227;
        if ((uVar59 & 1) == 0) {
          auVar228 = auVar209;
        }
        auVar159 = vmaxss_avx(auVar228,auVar159);
        auVar283 = vminps_avx(auVar283,auVar97);
        auVar97 = vminps_avx(auVar188,auVar176);
        auVar97 = vminps_avx(auVar283,auVar97);
        auVar147 = vshufps_avx(auVar147,auVar147,0x55);
        auVar147 = vblendps_avx(auVar147,auVar144,2);
        auVar144 = vpslld_avx(auVar147,0x1f);
        auVar147 = vshufpd_avx(auVar274,auVar274,1);
        auVar147 = vinsertps_avx(auVar147,auVar227,0x9c);
        auVar283 = vshufpd_avx(auVar125,auVar125,1);
        auVar283 = vinsertps_avx(auVar283,auVar209,0x9c);
        auVar147 = vblendvps_avx(auVar283,auVar147,auVar144);
        auVar283 = vmovshdup_avx(auVar147);
        auVar147 = vmaxss_avx(auVar283,auVar147);
        fVar137 = auVar97._0_4_;
        auVar283 = vmovshdup_avx(auVar97);
        fVar136 = auVar147._0_4_;
        fVar123 = auVar283._0_4_;
        fVar135 = auVar159._0_4_;
        if (((fVar137 < 0.0001) && (-0.0001 < fVar136)) || (fVar123 < 0.0001 && -0.0001 < fVar136))
        {
LAB_016ae228:
          auVar125 = vcmpps_avx(auVar97,_DAT_01f7aa10,1);
          auVar274 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar283 = vcmpss_avx(auVar159,ZEXT816(0) << 0x20,1);
          auVar111._8_4_ = 0x3f800000;
          auVar111._0_8_ = 0x3f8000003f800000;
          auVar111._12_4_ = 0x3f800000;
          auVar129._8_4_ = 0xbf800000;
          auVar129._0_8_ = 0xbf800000bf800000;
          auVar129._12_4_ = 0xbf800000;
          auVar283 = vblendvps_avx(auVar111,auVar129,auVar283);
          auVar125 = vblendvps_avx(auVar111,auVar129,auVar125);
          fVar207 = auVar125._0_4_;
          fVar66 = auVar283._0_4_;
          auVar283 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar207 == fVar66) && (!NAN(fVar207) && !NAN(fVar66))) {
            auVar283 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar207 == fVar66) && (!NAN(fVar207) && !NAN(fVar66))) {
            auVar274 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar125 = vmovshdup_avx(auVar125);
          fVar221 = auVar125._0_4_;
          if ((fVar207 != fVar221) || (NAN(fVar207) || NAN(fVar221))) {
            if ((fVar123 != fVar137) || (NAN(fVar123) || NAN(fVar137))) {
              auVar145._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
              auVar145._8_4_ = auVar97._8_4_ ^ 0x80000000;
              auVar145._12_4_ = auVar97._12_4_ ^ 0x80000000;
              auVar146._0_4_ = -fVar137 / (fVar123 - fVar137);
              auVar146._4_12_ = auVar145._4_12_;
              auVar97 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar146._0_4_)),auVar146,ZEXT416(0));
              auVar125 = auVar97;
            }
            else {
              auVar97 = ZEXT816(0) << 0x20;
              if ((fVar137 != 0.0) || (auVar125 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar137))) {
                auVar97 = SUB6416(ZEXT464(0x7f800000),0);
                auVar125 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar283 = vminss_avx(auVar283,auVar97);
            auVar274 = vmaxss_avx(auVar125,auVar274);
          }
          auVar147 = vcmpss_avx(auVar147,ZEXT416(0),1);
          auVar112._8_4_ = 0x3f800000;
          auVar112._0_8_ = 0x3f8000003f800000;
          auVar112._12_4_ = 0x3f800000;
          auVar130._8_4_ = 0xbf800000;
          auVar130._0_8_ = 0xbf800000bf800000;
          auVar130._12_4_ = 0xbf800000;
          auVar147 = vblendvps_avx(auVar112,auVar130,auVar147);
          fVar123 = auVar147._0_4_;
          if ((fVar66 != fVar123) || (NAN(fVar66) || NAN(fVar123))) {
            if ((fVar136 != fVar135) || (NAN(fVar136) || NAN(fVar135))) {
              auVar82._0_8_ = auVar159._0_8_ ^ 0x8000000080000000;
              auVar82._8_4_ = auVar159._8_4_ ^ 0x80000000;
              auVar82._12_4_ = auVar159._12_4_ ^ 0x80000000;
              auVar148._0_4_ = -fVar135 / (fVar136 - fVar135);
              auVar148._4_12_ = auVar82._4_12_;
              auVar147 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar148._0_4_)),auVar148,ZEXT416(0));
              auVar97 = auVar147;
            }
            else {
              auVar147 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar135 != 0.0) || (auVar97 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar135))) {
                auVar147 = SUB6416(ZEXT464(0xff800000),0);
                auVar97 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar283 = vminss_avx(auVar283,auVar97);
            auVar274 = vmaxss_avx(auVar147,auVar274);
          }
          if ((fVar221 != fVar123) || (NAN(fVar221) || NAN(fVar123))) {
            auVar283 = vminss_avx(auVar283,SUB6416(ZEXT464(0x3f800000),0));
            auVar274 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar274);
          }
          auVar147 = vmaxss_avx(ZEXT816(0) << 0x40,auVar283);
          auVar283 = vminss_avx(auVar274,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar147._0_4_ <= auVar283._0_4_) {
            auVar147 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar147._0_4_ + -0.1)));
            auVar283 = vminss_avx(ZEXT416((uint)(auVar283._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar168._0_8_ = auVar126._0_8_;
            auVar168._8_8_ = auVar168._0_8_;
            auVar247._8_8_ = auVar110._0_8_;
            auVar247._0_8_ = auVar110._0_8_;
            auVar261._8_8_ = auVar208._0_8_;
            auVar261._0_8_ = auVar208._0_8_;
            auVar97 = vshufpd_avx(auVar110,auVar110,3);
            auVar125 = vshufpd_avx(auVar208,auVar208,3);
            auVar274 = vshufps_avx(auVar147,auVar283,0);
            auVar83._8_4_ = 0x3f800000;
            auVar83._0_8_ = 0x3f8000003f800000;
            auVar83._12_4_ = 0x3f800000;
            auVar126 = vsubps_avx(auVar83,auVar274);
            local_538 = auVar69._0_4_;
            fStack_534 = auVar69._4_4_;
            fStack_530 = auVar69._8_4_;
            fStack_52c = auVar69._12_4_;
            fVar123 = auVar274._0_4_;
            auVar84._0_4_ = fVar123 * local_538;
            fVar135 = auVar274._4_4_;
            auVar84._4_4_ = fVar135 * fStack_534;
            fVar136 = auVar274._8_4_;
            auVar84._8_4_ = fVar136 * fStack_530;
            fVar137 = auVar274._12_4_;
            auVar84._12_4_ = fVar137 * fStack_52c;
            auVar204._0_4_ = fVar123 * auVar97._0_4_;
            auVar204._4_4_ = fVar135 * auVar97._4_4_;
            auVar204._8_4_ = fVar136 * auVar97._8_4_;
            auVar204._12_4_ = fVar137 * auVar97._12_4_;
            auVar215._0_4_ = fVar123 * auVar125._0_4_;
            auVar215._4_4_ = fVar135 * auVar125._4_4_;
            auVar215._8_4_ = fVar136 * auVar125._8_4_;
            auVar215._12_4_ = fVar137 * auVar125._12_4_;
            auVar234._0_4_ = fVar123 * auVar67._0_4_;
            auVar234._4_4_ = fVar135 * auVar67._4_4_;
            auVar234._8_4_ = fVar136 * auVar67._8_4_;
            auVar234._12_4_ = fVar137 * auVar67._12_4_;
            auVar97 = vfmadd231ps_fma(auVar84,auVar126,auVar168);
            auVar125 = vfmadd231ps_fma(auVar204,auVar126,auVar247);
            auVar274 = vfmadd231ps_fma(auVar215,auVar126,auVar261);
            auVar126 = vfmadd231ps_fma(auVar234,auVar126,ZEXT816(0));
            auVar69 = vmovshdup_avx(auVar177);
            auVar208 = vfmadd231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar147._0_4_)),auVar177,
                                       ZEXT416((uint)(1.0 - auVar147._0_4_)));
            auVar209 = vfmadd231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar283._0_4_)),auVar177,
                                       ZEXT416((uint)(1.0 - auVar283._0_4_)));
            fVar123 = 1.0 / fVar64;
            auVar147 = vsubps_avx(auVar125,auVar97);
            auVar248._0_4_ = auVar147._0_4_ * 3.0;
            auVar248._4_4_ = auVar147._4_4_ * 3.0;
            auVar248._8_4_ = auVar147._8_4_ * 3.0;
            auVar248._12_4_ = auVar147._12_4_ * 3.0;
            auVar147 = vsubps_avx(auVar274,auVar125);
            auVar262._0_4_ = auVar147._0_4_ * 3.0;
            auVar262._4_4_ = auVar147._4_4_ * 3.0;
            auVar262._8_4_ = auVar147._8_4_ * 3.0;
            auVar262._12_4_ = auVar147._12_4_ * 3.0;
            auVar147 = vsubps_avx(auVar126,auVar274);
            auVar275._0_4_ = auVar147._0_4_ * 3.0;
            auVar275._4_4_ = auVar147._4_4_ * 3.0;
            auVar275._8_4_ = auVar147._8_4_ * 3.0;
            auVar275._12_4_ = auVar147._12_4_ * 3.0;
            auVar69 = vminps_avx(auVar262,auVar275);
            auVar147 = vmaxps_avx(auVar262,auVar275);
            auVar69 = vminps_avx(auVar248,auVar69);
            auVar147 = vmaxps_avx(auVar248,auVar147);
            auVar67 = vshufpd_avx(auVar69,auVar69,3);
            auVar283 = vshufpd_avx(auVar147,auVar147,3);
            auVar69 = vminps_avx(auVar69,auVar67);
            auVar147 = vmaxps_avx(auVar147,auVar283);
            auVar263._0_4_ = auVar69._0_4_ * fVar123;
            auVar263._4_4_ = auVar69._4_4_ * fVar123;
            auVar263._8_4_ = auVar69._8_4_ * fVar123;
            auVar263._12_4_ = auVar69._12_4_ * fVar123;
            auVar249._0_4_ = auVar147._0_4_ * fVar123;
            auVar249._4_4_ = auVar147._4_4_ * fVar123;
            auVar249._8_4_ = auVar147._8_4_ * fVar123;
            auVar249._12_4_ = auVar147._12_4_ * fVar123;
            fVar123 = 1.0 / (auVar209._0_4_ - auVar208._0_4_);
            auVar147 = vshufpd_avx(auVar97,auVar97,3);
            auVar69 = vshufpd_avx(auVar125,auVar125,3);
            auVar67 = vshufpd_avx(auVar274,auVar274,3);
            auVar283 = vshufpd_avx(auVar126,auVar126,3);
            auVar147 = vsubps_avx(auVar147,auVar97);
            auVar97 = vsubps_avx(auVar69,auVar125);
            auVar125 = vsubps_avx(auVar67,auVar274);
            auVar283 = vsubps_avx(auVar283,auVar126);
            auVar69 = vminps_avx(auVar147,auVar97);
            auVar147 = vmaxps_avx(auVar147,auVar97);
            auVar67 = vminps_avx(auVar125,auVar283);
            auVar67 = vminps_avx(auVar69,auVar67);
            auVar69 = vmaxps_avx(auVar125,auVar283);
            auVar147 = vmaxps_avx(auVar147,auVar69);
            auVar295._0_4_ = fVar123 * auVar67._0_4_;
            auVar295._4_4_ = fVar123 * auVar67._4_4_;
            auVar295._8_4_ = fVar123 * auVar67._8_4_;
            auVar295._12_4_ = fVar123 * auVar67._12_4_;
            auVar284._0_4_ = fVar123 * auVar147._0_4_;
            auVar284._4_4_ = fVar123 * auVar147._4_4_;
            auVar284._8_4_ = fVar123 * auVar147._8_4_;
            auVar284._12_4_ = fVar123 * auVar147._12_4_;
            auVar283 = vinsertps_avx(auVar150,auVar208,0x10);
            auVar97 = vinsertps_avx(auVar151,auVar209,0x10);
            auVar276._0_4_ = (auVar283._0_4_ + auVar97._0_4_) * 0.5;
            auVar276._4_4_ = (auVar283._4_4_ + auVar97._4_4_) * 0.5;
            auVar276._8_4_ = (auVar283._8_4_ + auVar97._8_4_) * 0.5;
            auVar276._12_4_ = (auVar283._12_4_ + auVar97._12_4_) * 0.5;
            auVar85._4_4_ = auVar276._0_4_;
            auVar85._0_4_ = auVar276._0_4_;
            auVar85._8_4_ = auVar276._0_4_;
            auVar85._12_4_ = auVar276._0_4_;
            auVar147 = vfmadd213ps_fma(local_278,auVar85,auVar14);
            auVar69 = vfmadd213ps_fma(local_288,auVar85,auVar15);
            auVar67 = vfmadd213ps_fma(local_298,auVar85,auVar191);
            auVar151 = vsubps_avx(auVar69,auVar147);
            auVar147 = vfmadd213ps_fma(auVar151,auVar85,auVar147);
            auVar151 = vsubps_avx(auVar67,auVar69);
            auVar151 = vfmadd213ps_fma(auVar151,auVar85,auVar69);
            auVar151 = vsubps_avx(auVar151,auVar147);
            auVar147 = vfmadd231ps_fma(auVar147,auVar151,auVar85);
            auVar86._0_8_ = CONCAT44(auVar151._4_4_ * 3.0,auVar151._0_4_ * 3.0);
            auVar86._8_4_ = auVar151._8_4_ * 3.0;
            auVar86._12_4_ = auVar151._12_4_ * 3.0;
            auVar309._8_8_ = auVar147._0_8_;
            auVar309._0_8_ = auVar147._0_8_;
            auVar151 = vshufpd_avx(auVar147,auVar147,3);
            auVar147 = vshufps_avx(auVar276,auVar276,0x55);
            auVar274 = vsubps_avx(auVar151,auVar309);
            auVar159 = vfmadd231ps_fma(auVar309,auVar147,auVar274);
            auVar319._8_8_ = auVar86._0_8_;
            auVar319._0_8_ = auVar86._0_8_;
            auVar151 = vshufpd_avx(auVar86,auVar86,3);
            auVar151 = vsubps_avx(auVar151,auVar319);
            auVar126 = vfmadd213ps_fma(auVar151,auVar147,auVar319);
            auVar147 = vmovshdup_avx(auVar126);
            auVar320._0_8_ = auVar147._0_8_ ^ 0x8000000080000000;
            auVar320._8_4_ = auVar147._8_4_ ^ 0x80000000;
            auVar320._12_4_ = auVar147._12_4_ ^ 0x80000000;
            auVar69 = vmovshdup_avx(auVar274);
            auVar151 = vunpcklps_avx(auVar69,auVar320);
            auVar67 = vshufps_avx(auVar151,auVar320,4);
            auVar125 = vshufps_avx(auVar276,auVar276,0x54);
            auVar149._0_8_ = auVar274._0_8_ ^ 0x8000000080000000;
            auVar149._8_4_ = auVar274._8_4_ ^ 0x80000000;
            auVar149._12_4_ = auVar274._12_4_ ^ 0x80000000;
            auVar151 = vmovlhps_avx(auVar149,auVar126);
            auVar151 = vshufps_avx(auVar151,auVar126,8);
            auVar147 = vfmsub231ss_fma(ZEXT416((uint)(auVar274._0_4_ * auVar147._0_4_)),auVar69,
                                       auVar126);
            uVar65 = auVar147._0_4_;
            auVar87._4_4_ = uVar65;
            auVar87._0_4_ = uVar65;
            auVar87._8_4_ = uVar65;
            auVar87._12_4_ = uVar65;
            auVar147 = vdivps_avx(auVar67,auVar87);
            auVar69 = vdivps_avx(auVar151,auVar87);
            fVar136 = auVar159._0_4_;
            fVar123 = auVar147._0_4_;
            auVar151 = vshufps_avx(auVar159,auVar159,0x55);
            fVar135 = auVar69._0_4_;
            auVar88._0_4_ = fVar136 * fVar123 + auVar151._0_4_ * fVar135;
            auVar88._4_4_ = fVar136 * auVar147._4_4_ + auVar151._4_4_ * auVar69._4_4_;
            auVar88._8_4_ = fVar136 * auVar147._8_4_ + auVar151._8_4_ * auVar69._8_4_;
            auVar88._12_4_ = fVar136 * auVar147._12_4_ + auVar151._12_4_ * auVar69._12_4_;
            auVar176 = vsubps_avx(auVar125,auVar88);
            auVar125 = vmovshdup_avx(auVar147);
            auVar151 = vinsertps_avx(auVar263,auVar295,0x1c);
            auVar180._0_4_ = auVar125._0_4_ * auVar151._0_4_;
            auVar180._4_4_ = auVar125._4_4_ * auVar151._4_4_;
            auVar180._8_4_ = auVar125._8_4_ * auVar151._8_4_;
            auVar180._12_4_ = auVar125._12_4_ * auVar151._12_4_;
            auVar67 = vinsertps_avx(auVar249,auVar284,0x1c);
            auVar113._0_4_ = auVar67._0_4_ * auVar125._0_4_;
            auVar113._4_4_ = auVar67._4_4_ * auVar125._4_4_;
            auVar113._8_4_ = auVar67._8_4_ * auVar125._8_4_;
            auVar113._12_4_ = auVar67._12_4_ * auVar125._12_4_;
            auVar159 = vminps_avx(auVar180,auVar113);
            auVar126 = vmaxps_avx(auVar113,auVar180);
            auVar125 = vinsertps_avx(auVar295,auVar263,0x4c);
            auVar144 = vmovshdup_avx(auVar69);
            auVar274 = vinsertps_avx(auVar284,auVar249,0x4c);
            auVar285._0_4_ = auVar144._0_4_ * auVar125._0_4_;
            auVar285._4_4_ = auVar144._4_4_ * auVar125._4_4_;
            auVar285._8_4_ = auVar144._8_4_ * auVar125._8_4_;
            auVar285._12_4_ = auVar144._12_4_ * auVar125._12_4_;
            auVar264._0_4_ = auVar144._0_4_ * auVar274._0_4_;
            auVar264._4_4_ = auVar144._4_4_ * auVar274._4_4_;
            auVar264._8_4_ = auVar144._8_4_ * auVar274._8_4_;
            auVar264._12_4_ = auVar144._12_4_ * auVar274._12_4_;
            auVar144 = vminps_avx(auVar285,auVar264);
            auVar296._0_4_ = auVar159._0_4_ + auVar144._0_4_;
            auVar296._4_4_ = auVar159._4_4_ + auVar144._4_4_;
            auVar296._8_4_ = auVar159._8_4_ + auVar144._8_4_;
            auVar296._12_4_ = auVar159._12_4_ + auVar144._12_4_;
            auVar159 = vmaxps_avx(auVar264,auVar285);
            auVar114._0_4_ = auVar159._0_4_ + auVar126._0_4_;
            auVar114._4_4_ = auVar159._4_4_ + auVar126._4_4_;
            auVar114._8_4_ = auVar159._8_4_ + auVar126._8_4_;
            auVar114._12_4_ = auVar159._12_4_ + auVar126._12_4_;
            auVar265._8_8_ = 0x3f80000000000000;
            auVar265._0_8_ = 0x3f80000000000000;
            auVar126 = vsubps_avx(auVar265,auVar114);
            auVar159 = vsubps_avx(auVar265,auVar296);
            auVar144 = vsubps_avx(auVar283,auVar276);
            auVar188 = vsubps_avx(auVar97,auVar276);
            auVar131._0_4_ = fVar123 * auVar151._0_4_;
            auVar131._4_4_ = fVar123 * auVar151._4_4_;
            auVar131._8_4_ = fVar123 * auVar151._8_4_;
            auVar131._12_4_ = fVar123 * auVar151._12_4_;
            auVar297._0_4_ = fVar123 * auVar67._0_4_;
            auVar297._4_4_ = fVar123 * auVar67._4_4_;
            auVar297._8_4_ = fVar123 * auVar67._8_4_;
            auVar297._12_4_ = fVar123 * auVar67._12_4_;
            auVar67 = vminps_avx(auVar131,auVar297);
            auVar151 = vmaxps_avx(auVar297,auVar131);
            auVar181._0_4_ = fVar135 * auVar125._0_4_;
            auVar181._4_4_ = fVar135 * auVar125._4_4_;
            auVar181._8_4_ = fVar135 * auVar125._8_4_;
            auVar181._12_4_ = fVar135 * auVar125._12_4_;
            auVar250._0_4_ = fVar135 * auVar274._0_4_;
            auVar250._4_4_ = fVar135 * auVar274._4_4_;
            auVar250._8_4_ = fVar135 * auVar274._8_4_;
            auVar250._12_4_ = fVar135 * auVar274._12_4_;
            auVar125 = vminps_avx(auVar181,auVar250);
            auVar298._0_4_ = auVar67._0_4_ + auVar125._0_4_;
            auVar298._4_4_ = auVar67._4_4_ + auVar125._4_4_;
            auVar298._8_4_ = auVar67._8_4_ + auVar125._8_4_;
            auVar298._12_4_ = auVar67._12_4_ + auVar125._12_4_;
            fVar221 = auVar144._0_4_;
            auVar310._0_4_ = fVar221 * auVar126._0_4_;
            fVar222 = auVar144._4_4_;
            auVar310._4_4_ = fVar222 * auVar126._4_4_;
            fVar223 = auVar144._8_4_;
            auVar310._8_4_ = fVar223 * auVar126._8_4_;
            fVar224 = auVar144._12_4_;
            auVar310._12_4_ = fVar224 * auVar126._12_4_;
            auVar67 = vmaxps_avx(auVar250,auVar181);
            auVar251._0_4_ = fVar221 * auVar159._0_4_;
            auVar251._4_4_ = fVar222 * auVar159._4_4_;
            auVar251._8_4_ = fVar223 * auVar159._8_4_;
            auVar251._12_4_ = fVar224 * auVar159._12_4_;
            fVar136 = auVar188._0_4_;
            auVar115._0_4_ = fVar136 * auVar126._0_4_;
            fVar137 = auVar188._4_4_;
            auVar115._4_4_ = fVar137 * auVar126._4_4_;
            fVar66 = auVar188._8_4_;
            auVar115._8_4_ = fVar66 * auVar126._8_4_;
            fVar207 = auVar188._12_4_;
            auVar115._12_4_ = fVar207 * auVar126._12_4_;
            auVar266._0_4_ = fVar136 * auVar159._0_4_;
            auVar266._4_4_ = fVar137 * auVar159._4_4_;
            auVar266._8_4_ = fVar66 * auVar159._8_4_;
            auVar266._12_4_ = fVar207 * auVar159._12_4_;
            auVar132._0_4_ = auVar151._0_4_ + auVar67._0_4_;
            auVar132._4_4_ = auVar151._4_4_ + auVar67._4_4_;
            auVar132._8_4_ = auVar151._8_4_ + auVar67._8_4_;
            auVar132._12_4_ = auVar151._12_4_ + auVar67._12_4_;
            auVar182._8_8_ = 0x3f800000;
            auVar182._0_8_ = 0x3f800000;
            auVar151 = vsubps_avx(auVar182,auVar132);
            auVar67 = vsubps_avx(auVar182,auVar298);
            auVar299._0_4_ = fVar221 * auVar151._0_4_;
            auVar299._4_4_ = fVar222 * auVar151._4_4_;
            auVar299._8_4_ = fVar223 * auVar151._8_4_;
            auVar299._12_4_ = fVar224 * auVar151._12_4_;
            auVar286._0_4_ = fVar221 * auVar67._0_4_;
            auVar286._4_4_ = fVar222 * auVar67._4_4_;
            auVar286._8_4_ = fVar223 * auVar67._8_4_;
            auVar286._12_4_ = fVar224 * auVar67._12_4_;
            auVar133._0_4_ = fVar136 * auVar151._0_4_;
            auVar133._4_4_ = fVar137 * auVar151._4_4_;
            auVar133._8_4_ = fVar66 * auVar151._8_4_;
            auVar133._12_4_ = fVar207 * auVar151._12_4_;
            auVar183._0_4_ = fVar136 * auVar67._0_4_;
            auVar183._4_4_ = fVar137 * auVar67._4_4_;
            auVar183._8_4_ = fVar66 * auVar67._8_4_;
            auVar183._12_4_ = fVar207 * auVar67._12_4_;
            auVar151 = vminps_avx(auVar299,auVar286);
            auVar67 = vminps_avx(auVar133,auVar183);
            auVar151 = vminps_avx(auVar151,auVar67);
            auVar67 = vmaxps_avx(auVar286,auVar299);
            auVar125 = vmaxps_avx(auVar183,auVar133);
            auVar274 = vminps_avx(auVar310,auVar251);
            auVar126 = vminps_avx(auVar115,auVar266);
            auVar274 = vminps_avx(auVar274,auVar126);
            auVar151 = vhaddps_avx(auVar151,auVar274);
            auVar67 = vmaxps_avx(auVar125,auVar67);
            auVar125 = vmaxps_avx(auVar251,auVar310);
            auVar274 = vmaxps_avx(auVar266,auVar115);
            auVar125 = vmaxps_avx(auVar274,auVar125);
            auVar67 = vhaddps_avx(auVar67,auVar125);
            auVar151 = vshufps_avx(auVar151,auVar151,0xe8);
            auVar67 = vshufps_avx(auVar67,auVar67,0xe8);
            auVar267._0_4_ = auVar176._0_4_ + auVar151._0_4_;
            auVar267._4_4_ = auVar176._4_4_ + auVar151._4_4_;
            auVar267._8_4_ = auVar176._8_4_ + auVar151._8_4_;
            auVar267._12_4_ = auVar176._12_4_ + auVar151._12_4_;
            auVar252._0_4_ = auVar176._0_4_ + auVar67._0_4_;
            auVar252._4_4_ = auVar176._4_4_ + auVar67._4_4_;
            auVar252._8_4_ = auVar176._8_4_ + auVar67._8_4_;
            auVar252._12_4_ = auVar176._12_4_ + auVar67._12_4_;
            auVar151 = vmaxps_avx(auVar283,auVar267);
            auVar67 = vminps_avx(auVar252,auVar97);
            auVar151 = vcmpps_avx(auVar67,auVar151,1);
            auVar151 = vshufps_avx(auVar151,auVar151,0x50);
            if ((auVar151 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar151[0xf]) {
              bVar57 = 0;
              if ((fVar238 < auVar267._0_4_) && (bVar57 = 0, auVar252._0_4_ < auVar97._0_4_)) {
                auVar67 = vmovshdup_avx(auVar267);
                auVar151 = vcmpps_avx(auVar252,auVar97,1);
                bVar57 = auVar151[4] & auVar208._0_4_ < auVar67._0_4_;
              }
              if (((3 < uVar61 || fVar64 < 0.001) | bVar57) != 1) goto LAB_016aee9f;
              lVar56 = 200;
              do {
                fVar136 = auVar176._0_4_;
                fVar238 = 1.0 - fVar136;
                fVar64 = fVar238 * fVar238 * fVar238;
                fVar94 = fVar136 * 3.0 * fVar238 * fVar238;
                fVar238 = fVar238 * fVar136 * fVar136 * 3.0;
                auVar169._4_4_ = fVar64;
                auVar169._0_4_ = fVar64;
                auVar169._8_4_ = fVar64;
                auVar169._12_4_ = fVar64;
                auVar134._4_4_ = fVar94;
                auVar134._0_4_ = fVar94;
                auVar134._8_4_ = fVar94;
                auVar134._12_4_ = fVar94;
                auVar116._4_4_ = fVar238;
                auVar116._0_4_ = fVar238;
                auVar116._8_4_ = fVar238;
                auVar116._12_4_ = fVar238;
                fVar136 = fVar136 * fVar136 * fVar136;
                local_578 = auVar173._0_4_;
                fStack_574 = auVar173._4_4_;
                fStack_570 = auVar173._8_4_;
                fStack_56c = auVar173._12_4_;
                auVar184._0_4_ = fVar136 * local_578;
                auVar184._4_4_ = fVar136 * fStack_574;
                auVar184._8_4_ = fVar136 * fStack_570;
                auVar184._12_4_ = fVar136 * fStack_56c;
                auVar150 = vfmadd231ps_fma(auVar184,auVar116,auVar191);
                auVar150 = vfmadd231ps_fma(auVar150,auVar134,auVar15);
                auVar150 = vfmadd231ps_fma(auVar150,auVar169,auVar14);
                auVar117._8_8_ = auVar150._0_8_;
                auVar117._0_8_ = auVar150._0_8_;
                auVar150 = vshufpd_avx(auVar150,auVar150,3);
                auVar151 = vshufps_avx(auVar176,auVar176,0x55);
                auVar150 = vsubps_avx(auVar150,auVar117);
                auVar151 = vfmadd213ps_fma(auVar150,auVar151,auVar117);
                fVar64 = auVar151._0_4_;
                auVar150 = vshufps_avx(auVar151,auVar151,0x55);
                auVar118._0_4_ = fVar123 * fVar64 + fVar135 * auVar150._0_4_;
                auVar118._4_4_ = auVar147._4_4_ * fVar64 + auVar69._4_4_ * auVar150._4_4_;
                auVar118._8_4_ = auVar147._8_4_ * fVar64 + auVar69._8_4_ * auVar150._8_4_;
                auVar118._12_4_ = auVar147._12_4_ * fVar64 + auVar69._12_4_ * auVar150._12_4_;
                auVar176 = vsubps_avx(auVar176,auVar118);
                auVar150 = vandps_avx(local_398,auVar151);
                auVar151 = vshufps_avx(auVar150,auVar150,0xf5);
                auVar150 = vmaxss_avx(auVar151,auVar150);
                if (auVar150._0_4_ < fVar63) {
                  local_1f8 = auVar176._0_4_;
                  if ((0.0 <= local_1f8) && (local_1f8 <= 1.0)) {
                    auVar150 = vmovshdup_avx(auVar176);
                    fVar64 = auVar150._0_4_;
                    if ((0.0 <= fVar64) && (fVar64 <= 1.0)) {
                      auVar150 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                               ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                               0x1c);
                      auVar125 = vinsertps_avx(auVar150,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                      auVar150 = vdpps_avx(auVar125,local_3a8,0x7f);
                      auVar151 = vdpps_avx(auVar125,local_3b8,0x7f);
                      auVar147 = vdpps_avx(auVar125,local_2a8,0x7f);
                      auVar69 = vdpps_avx(auVar125,local_2b8,0x7f);
                      auVar67 = vdpps_avx(auVar125,local_2c8,0x7f);
                      auVar283 = vdpps_avx(auVar125,local_2d8,0x7f);
                      auVar97 = vdpps_avx(auVar125,local_2e8,0x7f);
                      auVar125 = vdpps_avx(auVar125,local_2f8,0x7f);
                      fVar94 = 1.0 - fVar64;
                      auVar150 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * auVar67._0_4_)),
                                                 ZEXT416((uint)fVar94),auVar150);
                      auVar151 = vfmadd231ss_fma(ZEXT416((uint)(auVar283._0_4_ * fVar64)),
                                                 ZEXT416((uint)fVar94),auVar151);
                      auVar147 = vfmadd231ss_fma(ZEXT416((uint)(auVar97._0_4_ * fVar64)),
                                                 ZEXT416((uint)fVar94),auVar147);
                      auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * auVar125._0_4_)),
                                                ZEXT416((uint)fVar94),auVar69);
                      fVar135 = 1.0 - local_1f8;
                      fVar94 = fVar135 * local_1f8 * local_1f8 * 3.0;
                      fVar137 = local_1f8 * local_1f8 * local_1f8;
                      auVar147 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * auVar69._0_4_)),
                                                 ZEXT416((uint)fVar94),auVar147);
                      fVar238 = local_1f8 * 3.0 * fVar135 * fVar135;
                      auVar151 = vfmadd231ss_fma(auVar147,ZEXT416((uint)fVar238),auVar151);
                      fVar123 = fVar135 * fVar135 * fVar135;
                      auVar150 = vfmadd231ss_fma(auVar151,ZEXT416((uint)fVar123),auVar150);
                      fVar136 = auVar150._0_4_;
                      if (((fVar62 <= fVar136) &&
                          (fVar66 = *(float *)(ray + k * 4 + 0x80), fVar136 <= fVar66)) &&
                         (pGVar6 = (context->scene->geometries).items[uVar53].ptr,
                         (pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                        auVar150 = vshufps_avx(auVar176,auVar176,0x55);
                        auVar253._8_4_ = 0x3f800000;
                        auVar253._0_8_ = 0x3f8000003f800000;
                        auVar253._12_4_ = 0x3f800000;
                        auVar151 = vsubps_avx(auVar253,auVar150);
                        fVar207 = auVar150._0_4_;
                        auVar268._0_4_ = fVar207 * (float)local_3e8._0_4_;
                        fVar221 = auVar150._4_4_;
                        auVar268._4_4_ = fVar221 * (float)local_3e8._4_4_;
                        fVar222 = auVar150._8_4_;
                        auVar268._8_4_ = fVar222 * fStack_3e0;
                        fVar223 = auVar150._12_4_;
                        auVar268._12_4_ = fVar223 * fStack_3dc;
                        local_4d8 = auVar18._0_4_;
                        fStack_4d4 = auVar18._4_4_;
                        fStack_4d0 = auVar18._8_4_;
                        fStack_4cc = auVar18._12_4_;
                        auVar277._0_4_ = fVar207 * local_4d8;
                        auVar277._4_4_ = fVar221 * fStack_4d4;
                        auVar277._8_4_ = fVar222 * fStack_4d0;
                        auVar277._12_4_ = fVar223 * fStack_4cc;
                        local_4e8 = auVar210._0_4_;
                        fStack_4e4 = auVar210._4_4_;
                        fStack_4e0 = auVar210._8_4_;
                        fStack_4dc = auVar210._12_4_;
                        auVar287._0_4_ = fVar207 * local_4e8;
                        auVar287._4_4_ = fVar221 * fStack_4e4;
                        auVar287._8_4_ = fVar222 * fStack_4e0;
                        auVar287._12_4_ = fVar223 * fStack_4dc;
                        local_4f8 = auVar257._0_4_;
                        fStack_4f4 = auVar257._4_4_;
                        fStack_4f0 = auVar257._8_4_;
                        fStack_4ec = auVar257._12_4_;
                        auVar300._0_4_ = fVar207 * local_4f8;
                        auVar300._4_4_ = fVar221 * fStack_4f4;
                        auVar300._8_4_ = fVar222 * fStack_4f0;
                        auVar300._12_4_ = fVar223 * fStack_4ec;
                        auVar147 = vfmadd231ps_fma(auVar268,auVar151,local_3c8);
                        auVar69 = vfmadd231ps_fma(auVar277,auVar151,auVar17);
                        auVar67 = vfmadd231ps_fma(auVar287,auVar151,local_3d8);
                        auVar283 = vfmadd231ps_fma(auVar300,auVar151,auVar16);
                        auVar151 = vsubps_avx(auVar69,auVar147);
                        auVar147 = vsubps_avx(auVar67,auVar69);
                        auVar69 = vsubps_avx(auVar283,auVar67);
                        auVar301._0_4_ = local_1f8 * auVar147._0_4_;
                        auVar301._4_4_ = local_1f8 * auVar147._4_4_;
                        auVar301._8_4_ = local_1f8 * auVar147._8_4_;
                        auVar301._12_4_ = local_1f8 * auVar147._12_4_;
                        auVar235._4_4_ = fVar135;
                        auVar235._0_4_ = fVar135;
                        auVar235._8_4_ = fVar135;
                        auVar235._12_4_ = fVar135;
                        auVar151 = vfmadd231ps_fma(auVar301,auVar235,auVar151);
                        auVar269._0_4_ = local_1f8 * auVar69._0_4_;
                        auVar269._4_4_ = local_1f8 * auVar69._4_4_;
                        auVar269._8_4_ = local_1f8 * auVar69._8_4_;
                        auVar269._12_4_ = local_1f8 * auVar69._12_4_;
                        auVar147 = vfmadd231ps_fma(auVar269,auVar235,auVar147);
                        auVar270._0_4_ = local_1f8 * auVar147._0_4_;
                        auVar270._4_4_ = local_1f8 * auVar147._4_4_;
                        auVar270._8_4_ = local_1f8 * auVar147._8_4_;
                        auVar270._12_4_ = local_1f8 * auVar147._12_4_;
                        auVar147 = vfmadd231ps_fma(auVar270,auVar235,auVar151);
                        auVar216._0_4_ = fVar137 * (float)local_348._0_4_;
                        auVar216._4_4_ = fVar137 * (float)local_348._4_4_;
                        auVar216._8_4_ = fVar137 * fStack_340;
                        auVar216._12_4_ = fVar137 * fStack_33c;
                        auVar170._4_4_ = fVar94;
                        auVar170._0_4_ = fVar94;
                        auVar170._8_4_ = fVar94;
                        auVar170._12_4_ = fVar94;
                        auVar151 = vfmadd132ps_fma(auVar170,auVar216,local_338);
                        auVar205._4_4_ = fVar238;
                        auVar205._0_4_ = fVar238;
                        auVar205._8_4_ = fVar238;
                        auVar205._12_4_ = fVar238;
                        auVar151 = vfmadd132ps_fma(auVar205,auVar151,local_328);
                        auVar217._0_4_ = auVar147._0_4_ * 3.0;
                        auVar217._4_4_ = auVar147._4_4_ * 3.0;
                        auVar217._8_4_ = auVar147._8_4_ * 3.0;
                        auVar217._12_4_ = auVar147._12_4_ * 3.0;
                        auVar185._4_4_ = fVar123;
                        auVar185._0_4_ = fVar123;
                        auVar185._8_4_ = fVar123;
                        auVar185._12_4_ = fVar123;
                        auVar147 = vfmadd132ps_fma(auVar185,auVar151,local_318);
                        auVar151 = vshufps_avx(auVar217,auVar217,0xc9);
                        auVar171._0_4_ = auVar147._0_4_ * auVar151._0_4_;
                        auVar171._4_4_ = auVar147._4_4_ * auVar151._4_4_;
                        auVar171._8_4_ = auVar147._8_4_ * auVar151._8_4_;
                        auVar171._12_4_ = auVar147._12_4_ * auVar151._12_4_;
                        auVar151 = vshufps_avx(auVar147,auVar147,0xc9);
                        auVar151 = vfmsub231ps_fma(auVar171,auVar217,auVar151);
                        local_208 = auVar151._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar136;
                          uVar65 = vextractps_avx(auVar151,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar65;
                          uVar65 = vextractps_avx(auVar151,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar65;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = local_208;
                          *(float *)(ray + k * 4 + 0xf0) = local_1f8;
                          *(float *)(ray + k * 4 + 0x100) = fVar64;
                          *(uint *)(ray + k * 4 + 0x110) = uVar5;
                          *(uint *)(ray + k * 4 + 0x120) = uVar53;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          auVar147 = vshufps_avx(auVar151,auVar151,0x55);
                          auVar151 = vshufps_avx(auVar151,auVar151,0xaa);
                          local_228[0] = (RTCHitN)auVar147[0];
                          local_228[1] = (RTCHitN)auVar147[1];
                          local_228[2] = (RTCHitN)auVar147[2];
                          local_228[3] = (RTCHitN)auVar147[3];
                          local_228[4] = (RTCHitN)auVar147[4];
                          local_228[5] = (RTCHitN)auVar147[5];
                          local_228[6] = (RTCHitN)auVar147[6];
                          local_228[7] = (RTCHitN)auVar147[7];
                          local_228[8] = (RTCHitN)auVar147[8];
                          local_228[9] = (RTCHitN)auVar147[9];
                          local_228[10] = (RTCHitN)auVar147[10];
                          local_228[0xb] = (RTCHitN)auVar147[0xb];
                          local_228[0xc] = (RTCHitN)auVar147[0xc];
                          local_228[0xd] = (RTCHitN)auVar147[0xd];
                          local_228[0xe] = (RTCHitN)auVar147[0xe];
                          local_228[0xf] = (RTCHitN)auVar147[0xf];
                          local_218 = auVar151;
                          uStack_204 = local_208;
                          uStack_200 = local_208;
                          uStack_1fc = local_208;
                          fStack_1f4 = local_1f8;
                          fStack_1f0 = local_1f8;
                          fStack_1ec = local_1f8;
                          local_1e8 = auVar150;
                          local_1d8 = CONCAT44(uStack_374,local_378);
                          uStack_1d0 = CONCAT44(uStack_36c,uStack_370);
                          local_1c8._4_4_ = uStack_364;
                          local_1c8._0_4_ = local_368;
                          local_1c8._8_4_ = uStack_360;
                          local_1c8._12_4_ = uStack_35c;
                          vpcmpeqd_avx2(ZEXT1632(local_1c8),ZEXT1632(local_1c8));
                          uStack_1b4 = context->user->instID[0];
                          local_1b8 = uStack_1b4;
                          uStack_1b0 = uStack_1b4;
                          uStack_1ac = uStack_1b4;
                          uStack_1a8 = context->user->instPrimID[0];
                          uStack_1a4 = uStack_1a8;
                          uStack_1a0 = uStack_1a8;
                          uStack_19c = uStack_1a8;
                          *(float *)(ray + k * 4 + 0x80) = fVar136;
                          local_458 = *local_448;
                          local_418.valid = (int *)local_458;
                          local_418.geometryUserPtr = pGVar6->userPtr;
                          local_418.context = context->user;
                          local_418.hit = local_228;
                          local_418.N = 4;
                          local_418.ray = (RTCRayN *)ray;
                          if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar6->intersectionFilterN)(&local_418);
                            auVar187._8_56_ = extraout_var;
                            auVar187._0_8_ = extraout_XMM1_Qa;
                            auVar151 = auVar187._0_16_;
                          }
                          if (local_458 == (undefined1  [16])0x0) {
                            auVar150 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar151 = vpcmpeqd_avx(auVar151,auVar151);
                            auVar150 = auVar150 ^ auVar151;
                          }
                          else {
                            p_Var12 = context->args->filter;
                            auVar151 = vpcmpeqd_avx(auVar150,auVar150);
                            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var12)(&local_418);
                              auVar151 = vpcmpeqd_avx(auVar151,auVar151);
                            }
                            auVar147 = vpcmpeqd_avx(local_458,_DAT_01f7aa10);
                            auVar150 = auVar147 ^ auVar151;
                            if (local_458 != (undefined1  [16])0x0) {
                              auVar147 = auVar147 ^ auVar151;
                              auVar151 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])local_418.hit
                                                       );
                              *(undefined1 (*) [16])(local_418.ray + 0xc0) = auVar151;
                              auVar151 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x10));
                              *(undefined1 (*) [16])(local_418.ray + 0xd0) = auVar151;
                              auVar151 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x20));
                              *(undefined1 (*) [16])(local_418.ray + 0xe0) = auVar151;
                              auVar151 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x30));
                              *(undefined1 (*) [16])(local_418.ray + 0xf0) = auVar151;
                              auVar151 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x40));
                              *(undefined1 (*) [16])(local_418.ray + 0x100) = auVar151;
                              auVar151 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x50));
                              *(undefined1 (*) [16])(local_418.ray + 0x110) = auVar151;
                              auVar151 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x60));
                              *(undefined1 (*) [16])(local_418.ray + 0x120) = auVar151;
                              auVar151 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x70));
                              *(undefined1 (*) [16])(local_418.ray + 0x130) = auVar151;
                              auVar151 = vmaskmovps_avx(auVar147,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x80));
                              *(undefined1 (*) [16])(local_418.ray + 0x140) = auVar151;
                            }
                          }
                          auVar89._8_8_ = 0x100000001;
                          auVar89._0_8_ = 0x100000001;
                          if ((auVar89 & auVar150) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar66;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar56 = lVar56 + -1;
              } while (lVar56 != 0);
            }
          }
        }
        else {
          auVar283 = vcmpps_avx(auVar283,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar125 = vcmpps_avx(auVar97,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar283 = vandps_avx(auVar125,auVar283);
          if (-0.0001 < fVar135 && (auVar283 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_016ae228;
        }
        if (uVar61 == 0) break;
      } while( true );
    }
    uVar65 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar90._4_4_ = uVar65;
    auVar90._0_4_ = uVar65;
    auVar90._8_4_ = uVar65;
    auVar90._12_4_ = uVar65;
    auVar150 = vcmpps_avx(local_358,auVar90,2);
    uVar53 = vmovmskps_avx(auVar150);
    uVar52 = uVar52 & uVar52 + 0xf & uVar53;
    if (uVar52 == 0) {
      return;
    }
  } while( true );
LAB_016aee9f:
  auVar150 = vinsertps_avx(auVar150,ZEXT416((uint)fVar94),0x10);
  auVar278 = ZEXT1664(auVar150);
  auVar150 = vinsertps_avx(auVar208,ZEXT416((uint)auVar209._0_4_),0x10);
  auVar187 = ZEXT1664(auVar150);
  goto LAB_016ad969;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }